

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int *piVar20;
  undefined1 auVar21 [16];
  void *pvVar22;
  char cVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  uint uVar36;
  long lVar37;
  long lVar38;
  _func_int ***ppp_Var39;
  uint uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  void *pvVar46;
  _func_int ***ppp_Var47;
  int iVar48;
  uint uVar49;
  long lVar50;
  uint uVar51;
  uint uVar52;
  undefined4 *puVar53;
  undefined1 (*pauVar54) [32];
  long lVar55;
  float *pfVar56;
  int iVar57;
  undefined4 *puVar58;
  undefined1 (*pauVar59) [32];
  undefined1 (*pauVar60) [16];
  long lVar61;
  bool bVar62;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar64;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar78 [16];
  float fVar65;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar88 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float sum [4];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [28];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar125;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar127 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  __m128 one;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [32];
  int elempack;
  ulong local_200;
  void *local_1e8;
  Allocator *local_1e0;
  undefined1 (*local_1d0) [32];
  ulong local_1c8;
  undefined1 local_1a8 [16];
  uint local_190;
  undefined1 (*local_180) [16];
  ulong local_178;
  ulong local_168;
  long local_150;
  long local_148;
  undefined1 local_118 [16];
  uint local_f8;
  Mat local_c8;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  void *local_38;
  float fVar63;
  undefined1 auVar85 [32];
  float fVar89;
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  
  uVar33 = bottom_blob->elemsize;
  iVar4 = (this->super_Convolution1D).kernel_w;
  iVar5 = (this->super_Convolution1D).dilation_w;
  iVar6 = bottom_blob->elempack;
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  local_c8.h = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.d = (int)local_c8.refcount;
  local_c8.c = local_c8.elempack;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_c8,opt);
  iVar48 = -100;
  if (((Allocator *)local_c8.data != (Allocator *)0x0) && ((long)local_c8.c * local_c8.cstep != 0))
  {
    uVar36 = (this->super_Convolution1D).num_output;
    lVar29 = 1;
    if (opt->use_packing_layout == true) {
      lVar29 = 8;
      if ((uVar36 & 7) != 0) {
        lVar29 = (ulong)((uVar36 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_c8.w + ~((iVar4 + -1) * iVar5)) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar36 / (int)lVar29,
                lVar29 * (uVar33 / (ulong)(long)iVar6),(int)lVar29,opt->blob_allocator);
    iVar4 = local_c8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar5 = (this->super_Convolution1D).kernel_w;
      uVar36 = (this->super_Convolution1D).activation_type;
      local_78 = (ulong)uVar36;
      iVar6 = (this->super_Convolution1D).dilation_w;
      lVar29 = (long)iVar6;
      iVar48 = (this->super_Convolution1D).stride_w;
      lVar30 = (long)iVar48;
      uVar24 = local_c8.h * local_c8.elempack;
      iVar25 = local_c8.w * local_c8.elempack;
      local_58 = (long)top_blob->w;
      local_80 = (long)top_blob->h * (long)top_blob->elempack;
      lVar55 = top_blob->elempack * local_58;
      iVar28 = (int)local_80;
      iVar57 = iVar28 + 7;
      if (-1 < iVar28) {
        iVar57 = iVar28;
      }
      pvVar7 = (this->super_Convolution1D).bias_data.data;
      uVar40 = iVar57 >> 3;
      lVar61 = (long)iVar25;
      iVar57 = (int)lVar55;
      if (7 < iVar28) {
        auVar209 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar212 = ZEXT1664(ZEXT816(0) << 0x40);
        local_70 = lVar61 * 4;
        local_200 = 0;
        auVar308._8_4_ = 0x3f318000;
        auVar308._0_8_ = 0x3f3180003f318000;
        auVar308._12_4_ = 0x3f318000;
        auVar308._16_4_ = 0x3f318000;
        auVar308._20_4_ = 0x3f318000;
        auVar308._24_4_ = 0x3f318000;
        auVar308._28_4_ = 0x3f318000;
        do {
          lVar31 = (long)top_blob->w;
          if (0 < lVar31) {
            uVar49 = local_c8.h * local_c8.elempack;
            iVar45 = top_blob->elempack;
            local_1d0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_200 * 8) >> 0x1f) << 0x20 |
                                     local_200 * 8 & 0xffffffff) / (long)iVar45) * lVar31 *
                         top_blob->elemsize + (long)top_blob->data);
            auVar91._8_8_ = 0;
            auVar91._0_8_ = local_118._8_8_;
            local_118 = auVar91 << 0x40;
            iVar43 = 0;
            auVar126._8_8_ = 0;
            auVar126._0_8_ = local_1a8._8_8_;
            local_1a8 = auVar126 << 0x40;
            local_148 = local_70;
            do {
              auVar303 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = ZEXT1664(ZEXT816(0) << 0x40);
              if (pvVar7 != (void *)0x0) {
                auVar88 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + local_200 * 0x20));
              }
              pauVar59 = (undefined1 (*) [32])
                         ((this->weight_data_tm).cstep * local_200 * (this->weight_data_tm).elemsize
                         + (long)(this->weight_data_tm).data);
              if ((int)uVar49 < 8) {
                auVar162 = ZEXT864(0);
                auVar124 = ZEXT864(0);
                uVar26 = 0;
              }
              else {
                auVar124 = ZEXT864(0);
                auVar162 = ZEXT864(0);
                iVar42 = 0;
                do {
                  lVar32 = (long)(iVar42 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      puVar53 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar32 + (long)iVar43 * 4);
                      iVar41 = iVar5;
                      do {
                        uVar2 = *puVar53;
                        auVar84._4_4_ = uVar2;
                        auVar84._0_4_ = uVar2;
                        auVar84._8_4_ = uVar2;
                        auVar84._12_4_ = uVar2;
                        auVar84._16_4_ = uVar2;
                        auVar84._20_4_ = uVar2;
                        auVar84._24_4_ = uVar2;
                        auVar84._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar84,auVar88._0_32_,*pauVar59);
                        uVar2 = puVar53[1];
                        auVar253._4_4_ = uVar2;
                        auVar253._0_4_ = uVar2;
                        auVar253._8_4_ = uVar2;
                        auVar253._12_4_ = uVar2;
                        auVar253._16_4_ = uVar2;
                        auVar253._20_4_ = uVar2;
                        auVar253._24_4_ = uVar2;
                        auVar253._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar253,auVar124._0_32_,pauVar59[1]);
                        uVar2 = puVar53[2];
                        auVar264._4_4_ = uVar2;
                        auVar264._0_4_ = uVar2;
                        auVar264._8_4_ = uVar2;
                        auVar264._12_4_ = uVar2;
                        auVar264._16_4_ = uVar2;
                        auVar264._20_4_ = uVar2;
                        auVar264._24_4_ = uVar2;
                        auVar264._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar264,auVar162._0_32_,pauVar59[2]);
                        uVar2 = puVar53[3];
                        auVar283._4_4_ = uVar2;
                        auVar283._0_4_ = uVar2;
                        auVar283._8_4_ = uVar2;
                        auVar283._12_4_ = uVar2;
                        auVar283._16_4_ = uVar2;
                        auVar283._20_4_ = uVar2;
                        auVar283._24_4_ = uVar2;
                        auVar283._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar283,auVar303._0_32_,pauVar59[3]);
                        uVar2 = puVar53[4];
                        auVar79._4_4_ = uVar2;
                        auVar79._0_4_ = uVar2;
                        auVar79._8_4_ = uVar2;
                        auVar79._12_4_ = uVar2;
                        auVar79._16_4_ = uVar2;
                        auVar79._20_4_ = uVar2;
                        auVar79._24_4_ = uVar2;
                        auVar79._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar79,ZEXT1632(auVar91),pauVar59[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[5];
                        auVar111._4_4_ = uVar2;
                        auVar111._0_4_ = uVar2;
                        auVar111._8_4_ = uVar2;
                        auVar111._12_4_ = uVar2;
                        auVar111._16_4_ = uVar2;
                        auVar111._20_4_ = uVar2;
                        auVar111._24_4_ = uVar2;
                        auVar111._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar111,ZEXT1632(auVar126),pauVar59[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar53[6];
                        auVar146._4_4_ = uVar2;
                        auVar146._0_4_ = uVar2;
                        auVar146._8_4_ = uVar2;
                        auVar146._12_4_ = uVar2;
                        auVar146._16_4_ = uVar2;
                        auVar146._20_4_ = uVar2;
                        auVar146._24_4_ = uVar2;
                        auVar146._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar146,ZEXT1632(auVar90),pauVar59[6]);
                        auVar162 = ZEXT1664(auVar91);
                        uVar2 = puVar53[7];
                        auVar299._4_4_ = uVar2;
                        auVar299._0_4_ = uVar2;
                        auVar299._8_4_ = uVar2;
                        auVar299._12_4_ = uVar2;
                        auVar299._16_4_ = uVar2;
                        auVar299._20_4_ = uVar2;
                        auVar299._24_4_ = uVar2;
                        auVar299._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar299,ZEXT1632(auVar92),pauVar59[7]);
                        auVar303 = ZEXT1664(auVar91);
                        pauVar59 = pauVar59 + 8;
                        puVar53 = puVar53 + iVar6 * 8;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_00536c31;
                    }
                  }
                  else {
                    puVar53 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar32 + (long)(iVar48 * local_c8.elempack * local_1a8._0_4_) * 4);
LAB_00536c31:
                    if (local_c8.elempack == 4) {
                      iVar41 = iVar5;
                      if (iVar5 < 1) goto LAB_00536d6c;
                      do {
                        uVar2 = *puVar53;
                        auVar223._4_4_ = uVar2;
                        auVar223._0_4_ = uVar2;
                        auVar223._8_4_ = uVar2;
                        auVar223._12_4_ = uVar2;
                        auVar223._16_4_ = uVar2;
                        auVar223._20_4_ = uVar2;
                        auVar223._24_4_ = uVar2;
                        auVar223._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar223,auVar88._0_32_,*pauVar59);
                        uVar2 = puVar53[1];
                        auVar254._4_4_ = uVar2;
                        auVar254._0_4_ = uVar2;
                        auVar254._8_4_ = uVar2;
                        auVar254._12_4_ = uVar2;
                        auVar254._16_4_ = uVar2;
                        auVar254._20_4_ = uVar2;
                        auVar254._24_4_ = uVar2;
                        auVar254._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar254,auVar124._0_32_,pauVar59[1]);
                        uVar2 = puVar53[2];
                        auVar265._4_4_ = uVar2;
                        auVar265._0_4_ = uVar2;
                        auVar265._8_4_ = uVar2;
                        auVar265._12_4_ = uVar2;
                        auVar265._16_4_ = uVar2;
                        auVar265._20_4_ = uVar2;
                        auVar265._24_4_ = uVar2;
                        auVar265._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar265,auVar162._0_32_,pauVar59[2]);
                        uVar2 = puVar53[3];
                        auVar284._4_4_ = uVar2;
                        auVar284._0_4_ = uVar2;
                        auVar284._8_4_ = uVar2;
                        auVar284._12_4_ = uVar2;
                        auVar284._16_4_ = uVar2;
                        auVar284._20_4_ = uVar2;
                        auVar284._24_4_ = uVar2;
                        auVar284._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar284,auVar303._0_32_,pauVar59[3]);
                        uVar2 = puVar53[lVar61];
                        auVar80._4_4_ = uVar2;
                        auVar80._0_4_ = uVar2;
                        auVar80._8_4_ = uVar2;
                        auVar80._12_4_ = uVar2;
                        auVar80._16_4_ = uVar2;
                        auVar80._20_4_ = uVar2;
                        auVar80._24_4_ = uVar2;
                        auVar80._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar80,ZEXT1632(auVar91),pauVar59[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 1];
                        auVar112._4_4_ = uVar2;
                        auVar112._0_4_ = uVar2;
                        auVar112._8_4_ = uVar2;
                        auVar112._12_4_ = uVar2;
                        auVar112._16_4_ = uVar2;
                        auVar112._20_4_ = uVar2;
                        auVar112._24_4_ = uVar2;
                        auVar112._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar112,ZEXT1632(auVar126),pauVar59[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 2];
                        auVar147._4_4_ = uVar2;
                        auVar147._0_4_ = uVar2;
                        auVar147._8_4_ = uVar2;
                        auVar147._12_4_ = uVar2;
                        auVar147._16_4_ = uVar2;
                        auVar147._20_4_ = uVar2;
                        auVar147._24_4_ = uVar2;
                        auVar147._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar147,ZEXT1632(auVar90),pauVar59[6]);
                        auVar162 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 3];
                        auVar300._4_4_ = uVar2;
                        auVar300._0_4_ = uVar2;
                        auVar300._8_4_ = uVar2;
                        auVar300._12_4_ = uVar2;
                        auVar300._16_4_ = uVar2;
                        auVar300._20_4_ = uVar2;
                        auVar300._24_4_ = uVar2;
                        auVar300._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar300,ZEXT1632(auVar92),pauVar59[7]);
                        auVar303 = ZEXT1664(auVar91);
                        pauVar59 = pauVar59 + 8;
                        puVar53 = puVar53 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar53;
                        auVar224._4_4_ = uVar2;
                        auVar224._0_4_ = uVar2;
                        auVar224._8_4_ = uVar2;
                        auVar224._12_4_ = uVar2;
                        auVar224._16_4_ = uVar2;
                        auVar224._20_4_ = uVar2;
                        auVar224._24_4_ = uVar2;
                        auVar224._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar224,auVar88._0_32_,*pauVar59);
                        uVar2 = puVar53[lVar61];
                        auVar255._4_4_ = uVar2;
                        auVar255._0_4_ = uVar2;
                        auVar255._8_4_ = uVar2;
                        auVar255._12_4_ = uVar2;
                        auVar255._16_4_ = uVar2;
                        auVar255._20_4_ = uVar2;
                        auVar255._24_4_ = uVar2;
                        auVar255._28_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar255,auVar124._0_32_,pauVar59[1]);
                        uVar2 = puVar53[iVar25 * 2];
                        auVar266._4_4_ = uVar2;
                        auVar266._0_4_ = uVar2;
                        auVar266._8_4_ = uVar2;
                        auVar266._12_4_ = uVar2;
                        auVar266._16_4_ = uVar2;
                        auVar266._20_4_ = uVar2;
                        auVar266._24_4_ = uVar2;
                        auVar266._28_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar266,auVar162._0_32_,pauVar59[2]);
                        uVar2 = puVar53[iVar25 * 3];
                        auVar285._4_4_ = uVar2;
                        auVar285._0_4_ = uVar2;
                        auVar285._8_4_ = uVar2;
                        auVar285._12_4_ = uVar2;
                        auVar285._16_4_ = uVar2;
                        auVar285._20_4_ = uVar2;
                        auVar285._24_4_ = uVar2;
                        auVar285._28_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar285,auVar303._0_32_,pauVar59[3]);
                        uVar2 = puVar53[iVar25 * 4];
                        auVar81._4_4_ = uVar2;
                        auVar81._0_4_ = uVar2;
                        auVar81._8_4_ = uVar2;
                        auVar81._12_4_ = uVar2;
                        auVar81._16_4_ = uVar2;
                        auVar81._20_4_ = uVar2;
                        auVar81._24_4_ = uVar2;
                        auVar81._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar81,ZEXT1632(auVar91),pauVar59[4]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 5];
                        auVar113._4_4_ = uVar2;
                        auVar113._0_4_ = uVar2;
                        auVar113._8_4_ = uVar2;
                        auVar113._12_4_ = uVar2;
                        auVar113._16_4_ = uVar2;
                        auVar113._20_4_ = uVar2;
                        auVar113._24_4_ = uVar2;
                        auVar113._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar113,ZEXT1632(auVar126),pauVar59[5]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 6];
                        auVar148._4_4_ = uVar2;
                        auVar148._0_4_ = uVar2;
                        auVar148._8_4_ = uVar2;
                        auVar148._12_4_ = uVar2;
                        auVar148._16_4_ = uVar2;
                        auVar148._20_4_ = uVar2;
                        auVar148._24_4_ = uVar2;
                        auVar148._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar148,ZEXT1632(auVar90),pauVar59[6]);
                        auVar162 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 7];
                        auVar301._4_4_ = uVar2;
                        auVar301._0_4_ = uVar2;
                        auVar301._8_4_ = uVar2;
                        auVar301._12_4_ = uVar2;
                        auVar301._16_4_ = uVar2;
                        auVar301._20_4_ = uVar2;
                        auVar301._24_4_ = uVar2;
                        auVar301._28_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar301,ZEXT1632(auVar92),pauVar59[7]);
                        auVar303 = ZEXT1664(auVar91);
                        pauVar59 = pauVar59 + 8;
                        puVar53 = puVar53 + lVar29;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
LAB_00536d6c:
                  iVar41 = iVar42 + 0xf;
                  iVar42 = iVar42 + 8;
                  uVar26 = uVar49 & 0xfffffff8;
                } while (iVar41 < (int)uVar49);
              }
              auVar111 = auVar303._0_32_;
              auVar79 = auVar162._0_32_;
              if ((int)(uVar26 | 3) < (int)uVar49) {
                uVar51 = uVar26;
                do {
                  lVar32 = (long)((int)uVar51 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      puVar53 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar32 + (long)iVar43 * 4);
                      iVar42 = iVar5;
                      do {
                        uVar2 = *puVar53;
                        auVar225._4_4_ = uVar2;
                        auVar225._0_4_ = uVar2;
                        auVar225._8_4_ = uVar2;
                        auVar225._12_4_ = uVar2;
                        auVar225._16_4_ = uVar2;
                        auVar225._20_4_ = uVar2;
                        auVar225._24_4_ = uVar2;
                        auVar225._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar225,*pauVar59);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[1];
                        auVar226._4_4_ = uVar2;
                        auVar226._0_4_ = uVar2;
                        auVar226._8_4_ = uVar2;
                        auVar226._12_4_ = uVar2;
                        auVar226._16_4_ = uVar2;
                        auVar226._20_4_ = uVar2;
                        auVar226._24_4_ = uVar2;
                        auVar226._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar226,pauVar59[1]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar53[2];
                        auVar227._4_4_ = uVar2;
                        auVar227._0_4_ = uVar2;
                        auVar227._8_4_ = uVar2;
                        auVar227._12_4_ = uVar2;
                        auVar227._16_4_ = uVar2;
                        auVar227._20_4_ = uVar2;
                        auVar227._24_4_ = uVar2;
                        auVar227._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar162._0_32_,auVar227,pauVar59[2]);
                        auVar162 = ZEXT1664(auVar91);
                        uVar2 = puVar53[3];
                        auVar228._4_4_ = uVar2;
                        auVar228._0_4_ = uVar2;
                        auVar228._8_4_ = uVar2;
                        auVar228._12_4_ = uVar2;
                        auVar228._16_4_ = uVar2;
                        auVar228._20_4_ = uVar2;
                        auVar228._24_4_ = uVar2;
                        auVar228._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar303._0_32_,auVar228,pauVar59[3]);
                        auVar303 = ZEXT1664(auVar91);
                        pauVar59 = pauVar59 + 4;
                        puVar53 = puVar53 + iVar6 * 4;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_00536e3d;
                    }
                  }
                  else {
                    puVar53 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar32 + (long)(iVar48 * local_c8.elempack * local_1a8._0_4_) * 4);
LAB_00536e3d:
                    if ((local_c8.elempack == 1) && (iVar42 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar53;
                        auVar229._4_4_ = uVar2;
                        auVar229._0_4_ = uVar2;
                        auVar229._8_4_ = uVar2;
                        auVar229._12_4_ = uVar2;
                        auVar229._16_4_ = uVar2;
                        auVar229._20_4_ = uVar2;
                        auVar229._24_4_ = uVar2;
                        auVar229._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar229,*pauVar59);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61];
                        auVar230._4_4_ = uVar2;
                        auVar230._0_4_ = uVar2;
                        auVar230._8_4_ = uVar2;
                        auVar230._12_4_ = uVar2;
                        auVar230._16_4_ = uVar2;
                        auVar230._20_4_ = uVar2;
                        auVar230._24_4_ = uVar2;
                        auVar230._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar230,pauVar59[1]);
                        auVar124 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 2];
                        auVar231._4_4_ = uVar2;
                        auVar231._0_4_ = uVar2;
                        auVar231._8_4_ = uVar2;
                        auVar231._12_4_ = uVar2;
                        auVar231._16_4_ = uVar2;
                        auVar231._20_4_ = uVar2;
                        auVar231._24_4_ = uVar2;
                        auVar231._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar162._0_32_,auVar231,pauVar59[2]);
                        auVar162 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 3];
                        auVar232._4_4_ = uVar2;
                        auVar232._0_4_ = uVar2;
                        auVar232._8_4_ = uVar2;
                        auVar232._12_4_ = uVar2;
                        auVar232._16_4_ = uVar2;
                        auVar232._20_4_ = uVar2;
                        auVar232._24_4_ = uVar2;
                        auVar232._28_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar303._0_32_,auVar232,pauVar59[3]);
                        auVar303 = ZEXT1664(auVar91);
                        pauVar59 = pauVar59 + 4;
                        puVar53 = puVar53 + lVar29;
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
                  auVar111 = auVar303._0_32_;
                  auVar79 = auVar162._0_32_;
                  uVar26 = uVar51 + 4;
                  iVar42 = uVar51 + 7;
                  uVar51 = uVar26;
                } while (iVar42 < (int)uVar49);
              }
              auVar146 = auVar124._0_32_;
              uVar33 = (ulong)uVar26;
              if ((int)(uVar26 | 1) < (int)uVar49) {
                lVar37 = (long)local_c8.w * local_c8.elemsize * uVar33;
                lVar50 = (long)(_func_int ***)local_c8.data + lVar37 + local_148;
                lVar32 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar37 = (long)(_func_int ***)local_c8.data + lVar37 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar38 = 0;
                    iVar42 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)(lVar37 + lVar38);
                      auVar233._4_4_ = uVar2;
                      auVar233._0_4_ = uVar2;
                      auVar233._8_4_ = uVar2;
                      auVar233._12_4_ = uVar2;
                      auVar233._16_4_ = uVar2;
                      auVar233._20_4_ = uVar2;
                      auVar233._24_4_ = uVar2;
                      auVar233._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar233,*pauVar59);
                      auVar88 = ZEXT1664(auVar91);
                      uVar2 = *(undefined4 *)(lVar50 + lVar38);
                      auVar234._4_4_ = uVar2;
                      auVar234._0_4_ = uVar2;
                      auVar234._8_4_ = uVar2;
                      auVar234._12_4_ = uVar2;
                      auVar234._16_4_ = uVar2;
                      auVar234._20_4_ = uVar2;
                      auVar234._24_4_ = uVar2;
                      auVar234._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar124._0_32_,auVar234,pauVar59[1]);
                      auVar124 = ZEXT1664(auVar91);
                      pauVar59 = pauVar59 + 2;
                      lVar38 = lVar38 + lVar29 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  auVar146 = auVar124._0_32_;
                  uVar33 = uVar33 + 2;
                  uVar26 = (uint)uVar33;
                  lVar50 = lVar50 + lVar32;
                  lVar37 = lVar37 + lVar32;
                } while ((int)(uVar26 | 1) < (int)uVar49);
              }
              auVar84 = auVar88._0_32_;
              if ((int)uVar26 < (int)uVar49) {
                uVar33 = (ulong)uVar26;
                puVar53 = (undefined4 *)
                          ((long)(_func_int ***)local_c8.data +
                          (long)local_c8.w * local_c8.elemsize * uVar33 + local_118._0_8_);
                do {
                  puVar58 = puVar53;
                  iVar42 = iVar5;
                  if (0 < iVar5) {
                    do {
                      uVar2 = *puVar58;
                      auVar235._4_4_ = uVar2;
                      auVar235._0_4_ = uVar2;
                      auVar235._8_4_ = uVar2;
                      auVar235._12_4_ = uVar2;
                      auVar235._16_4_ = uVar2;
                      auVar235._20_4_ = uVar2;
                      auVar235._24_4_ = uVar2;
                      auVar235._28_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar88._0_32_,auVar235,*pauVar59);
                      auVar88 = ZEXT1664(auVar91);
                      pauVar59 = pauVar59 + 1;
                      puVar58 = puVar58 + lVar29;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  auVar84 = auVar88._0_32_;
                  uVar33 = uVar33 + 1;
                  puVar53 = (undefined4 *)((long)puVar53 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar33 < (int)uVar49);
              }
              fVar63 = auVar111._0_4_ + auVar79._0_4_ + auVar146._0_4_ + auVar84._0_4_;
              fVar89 = auVar111._4_4_ + auVar79._4_4_ + auVar146._4_4_ + auVar84._4_4_;
              auVar82._0_8_ = CONCAT44(fVar89,fVar63);
              auVar82._8_4_ = auVar111._8_4_ + auVar79._8_4_ + auVar146._8_4_ + auVar84._8_4_;
              auVar82._12_4_ = auVar111._12_4_ + auVar79._12_4_ + auVar146._12_4_ + auVar84._12_4_;
              auVar82._16_4_ = auVar111._16_4_ + auVar79._16_4_ + auVar146._16_4_ + auVar84._16_4_;
              auVar82._20_4_ = auVar111._20_4_ + auVar79._20_4_ + auVar146._20_4_ + auVar84._20_4_;
              auVar82._24_4_ = auVar111._24_4_ + auVar79._24_4_ + auVar146._24_4_ + auVar84._24_4_;
              auVar82._28_4_ = auVar111._28_4_ + auVar79._28_4_ + auVar146._28_4_ + auVar84._28_4_;
              auVar146 = auVar212._0_32_;
              auVar79 = auVar204._0_32_;
              auVar111 = auVar209._0_32_;
              fVar65 = auVar204._0_4_;
              fVar64 = auVar204._4_4_;
              fVar3 = auVar204._8_4_;
              fVar125 = auVar204._12_4_;
              fVar13 = auVar204._16_4_;
              fVar14 = auVar204._20_4_;
              fVar15 = auVar204._24_4_;
              fVar16 = auVar204._28_4_;
              switch(uVar36) {
              case 1:
                auVar82 = vmaxps_avx(auVar82,auVar146);
                break;
              case 2:
                auVar79 = vmaxps_avx(auVar82,auVar146);
                auVar111 = vminps_avx(auVar82,auVar146);
                uVar2 = *(this->super_Convolution1D).activation_params.data;
                auVar87._4_4_ = uVar2;
                auVar87._0_4_ = uVar2;
                auVar87._8_4_ = uVar2;
                auVar87._12_4_ = uVar2;
                auVar87._16_4_ = uVar2;
                auVar87._20_4_ = uVar2;
                auVar87._24_4_ = uVar2;
                auVar87._28_4_ = uVar2;
                auVar91 = vfmadd213ps_fma(auVar87,auVar111,auVar79);
                auVar82 = ZEXT1632(auVar91);
                break;
              case 3:
                puVar53 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar53;
                auVar118._4_4_ = uVar2;
                auVar118._0_4_ = uVar2;
                auVar118._8_4_ = uVar2;
                auVar118._12_4_ = uVar2;
                auVar118._16_4_ = uVar2;
                auVar118._20_4_ = uVar2;
                auVar118._24_4_ = uVar2;
                auVar118._28_4_ = uVar2;
                uVar2 = puVar53[1];
                auVar156._4_4_ = uVar2;
                auVar156._0_4_ = uVar2;
                auVar156._8_4_ = uVar2;
                auVar156._12_4_ = uVar2;
                auVar156._16_4_ = uVar2;
                auVar156._20_4_ = uVar2;
                auVar156._24_4_ = uVar2;
                auVar156._28_4_ = uVar2;
                auVar79 = vmaxps_avx(auVar82,auVar118);
                auVar82 = vminps_avx(auVar79,auVar156);
                break;
              case 4:
                auVar83._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar83._8_4_ = -auVar82._8_4_;
                auVar83._12_4_ = -auVar82._12_4_;
                auVar83._16_4_ = -auVar82._16_4_;
                auVar83._20_4_ = -auVar82._20_4_;
                auVar83._24_4_ = -auVar82._24_4_;
                auVar83._28_4_ = -auVar82._28_4_;
                auVar119._8_4_ = 0x42b0c0a5;
                auVar119._0_8_ = 0x42b0c0a542b0c0a5;
                auVar119._12_4_ = 0x42b0c0a5;
                auVar119._16_4_ = 0x42b0c0a5;
                auVar119._20_4_ = 0x42b0c0a5;
                auVar119._24_4_ = 0x42b0c0a5;
                auVar119._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar83,auVar119);
                auVar120._8_4_ = 0xc2b0c0a5;
                auVar120._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar120._12_4_ = 0xc2b0c0a5;
                auVar120._16_4_ = 0xc2b0c0a5;
                auVar120._20_4_ = 0xc2b0c0a5;
                auVar120._24_4_ = 0xc2b0c0a5;
                auVar120._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar146,auVar120);
                auVar121._8_4_ = 0x3fb8aa3b;
                auVar121._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar121._12_4_ = 0x3fb8aa3b;
                auVar121._16_4_ = 0x3fb8aa3b;
                auVar121._20_4_ = 0x3fb8aa3b;
                auVar121._24_4_ = 0x3fb8aa3b;
                auVar121._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar121,auVar84,auVar111);
                auVar253 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar91),auVar253,1);
                auVar146 = vandps_avx(auVar146,auVar79);
                auVar146 = vsubps_avx(auVar253,auVar146);
                auVar157._8_4_ = 0x3f318000;
                auVar157._0_8_ = 0x3f3180003f318000;
                auVar157._12_4_ = 0x3f318000;
                auVar157._16_4_ = 0x3f318000;
                auVar157._20_4_ = 0x3f318000;
                auVar157._24_4_ = 0x3f318000;
                auVar157._28_4_ = 0x3f318000;
                auVar91 = vfmsub231ps_fma(auVar84,auVar146,auVar157);
                auVar158._8_4_ = 0x395e8083;
                auVar158._0_8_ = 0x395e8083395e8083;
                auVar158._12_4_ = 0x395e8083;
                auVar158._16_4_ = 0x395e8083;
                auVar158._20_4_ = 0x395e8083;
                auVar158._24_4_ = 0x395e8083;
                auVar158._28_4_ = 0x395e8083;
                auVar126 = vfmsub231ps_fma(ZEXT1632(auVar91),auVar146,auVar158);
                auVar84 = ZEXT1632(auVar126);
                auVar19._28_4_ = 0x395e8083;
                auVar19._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar239._8_4_ = 0x39506967;
                auVar239._0_8_ = 0x3950696739506967;
                auVar239._12_4_ = 0x39506967;
                auVar239._16_4_ = 0x39506967;
                auVar239._20_4_ = 0x39506967;
                auVar239._24_4_ = 0x39506967;
                auVar239._28_4_ = 0x39506967;
                auVar201._8_4_ = 0x3ab743ce;
                auVar201._0_8_ = 0x3ab743ce3ab743ce;
                auVar201._12_4_ = 0x3ab743ce;
                auVar201._16_4_ = 0x3ab743ce;
                auVar201._20_4_ = 0x3ab743ce;
                auVar201._24_4_ = 0x3ab743ce;
                auVar201._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar239,auVar84,auVar201);
                auVar202._8_4_ = 0x3c088908;
                auVar202._0_8_ = 0x3c0889083c088908;
                auVar202._12_4_ = 0x3c088908;
                auVar202._16_4_ = 0x3c088908;
                auVar202._20_4_ = 0x3c088908;
                auVar202._24_4_ = 0x3c088908;
                auVar202._28_4_ = 0x3c088908;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar202);
                auVar191._8_4_ = 0x3d2aa9c1;
                auVar191._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar191._12_4_ = 0x3d2aa9c1;
                auVar191._16_4_ = 0x3d2aa9c1;
                auVar191._20_4_ = 0x3d2aa9c1;
                auVar191._24_4_ = 0x3d2aa9c1;
                auVar191._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar191);
                auVar192._8_4_ = 0x3e2aaaaa;
                auVar192._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar192._12_4_ = 0x3e2aaaaa;
                auVar192._16_4_ = 0x3e2aaaaa;
                auVar192._20_4_ = 0x3e2aaaaa;
                auVar192._24_4_ = 0x3e2aaaaa;
                auVar192._28_4_ = 0x3e2aaaaa;
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar192);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar90 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar19,auVar84);
                auVar66._0_4_ = (int)auVar146._0_4_;
                auVar66._4_4_ = (int)auVar146._4_4_;
                auVar66._8_4_ = (int)auVar146._8_4_;
                auVar66._12_4_ = (int)auVar146._12_4_;
                auVar85._16_4_ = (int)auVar146._16_4_;
                auVar85._0_16_ = auVar66;
                auVar85._20_4_ = (int)auVar146._20_4_;
                auVar85._24_4_ = (int)auVar146._24_4_;
                auVar85._28_4_ = (int)auVar146._28_4_;
                auVar126 = vpslld_avx(auVar66,0x17);
                auVar91 = vpslld_avx(auVar85._16_16_,0x17);
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = 0x3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar127);
                auVar126 = vpaddd_avx(auVar126,auVar127);
                auVar86._16_16_ = auVar91;
                auVar86._0_16_ = auVar126;
                auVar122._0_4_ = auVar90._0_4_ + fVar65;
                auVar122._4_4_ = auVar90._4_4_ + fVar64;
                auVar122._8_4_ = auVar90._8_4_ + fVar3;
                auVar122._12_4_ = auVar90._12_4_ + fVar125;
                auVar122._16_4_ = fVar13 + 0.0;
                auVar122._20_4_ = fVar14 + 0.0;
                auVar122._24_4_ = fVar15 + 0.0;
                auVar122._28_4_ = fVar16 + 0.0;
                auVar91 = vfmadd213ps_fma(auVar86,auVar122,auVar79);
                auVar82 = vdivps_avx(auVar79,ZEXT1632(auVar91));
                break;
              case 5:
                auVar302._8_4_ = 0x42b0c0a5;
                auVar302._0_8_ = 0x42b0c0a542b0c0a5;
                auVar302._12_4_ = 0x42b0c0a5;
                auVar302._16_4_ = 0x42b0c0a5;
                auVar302._20_4_ = 0x42b0c0a5;
                auVar302._24_4_ = 0x42b0c0a5;
                auVar302._28_4_ = 0x42b0c0a5;
                auVar146 = vminps_avx(auVar302,auVar82);
                auVar296._8_4_ = 0xc2b0c0a5;
                auVar296._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar296._12_4_ = 0xc2b0c0a5;
                auVar296._16_4_ = 0xc2b0c0a5;
                auVar296._20_4_ = 0xc2b0c0a5;
                auVar296._24_4_ = 0xc2b0c0a5;
                auVar296._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar296,auVar146);
                auVar149._8_4_ = 0x3fb8aa3b;
                auVar149._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar149._12_4_ = 0x3fb8aa3b;
                auVar149._16_4_ = 0x3fb8aa3b;
                auVar149._20_4_ = 0x3fb8aa3b;
                auVar149._24_4_ = 0x3fb8aa3b;
                auVar149._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar149,auVar84,auVar111);
                auVar253 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar91),auVar253,1);
                auVar146 = vandps_avx(auVar146,auVar79);
                auVar146 = vsubps_avx(auVar253,auVar146);
                auVar91 = vfmsub231ps_fma(auVar84,auVar146,auVar308);
                auVar297._8_4_ = 0xb95e8083;
                auVar297._0_8_ = 0xb95e8083b95e8083;
                auVar297._12_4_ = 0xb95e8083;
                auVar297._16_4_ = 0xb95e8083;
                auVar297._20_4_ = 0xb95e8083;
                auVar297._24_4_ = 0xb95e8083;
                auVar297._28_4_ = 0xb95e8083;
                auVar126 = vfnmsub231ps_fma(ZEXT1632(auVar91),auVar146,auVar297);
                auVar84 = ZEXT1632(auVar126);
                auVar17._28_4_ = auVar253._28_4_;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar256._8_4_ = 0x39506967;
                auVar256._0_8_ = 0x3950696739506967;
                auVar256._12_4_ = 0x39506967;
                auVar256._16_4_ = 0x39506967;
                auVar256._20_4_ = 0x39506967;
                auVar256._24_4_ = 0x39506967;
                auVar256._28_4_ = 0x39506967;
                auVar199._8_4_ = 0x3ab743ce;
                auVar199._0_8_ = 0x3ab743ce3ab743ce;
                auVar199._12_4_ = 0x3ab743ce;
                auVar199._16_4_ = 0x3ab743ce;
                auVar199._20_4_ = 0x3ab743ce;
                auVar199._24_4_ = 0x3ab743ce;
                auVar199._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar256,auVar84,auVar199);
                auVar211._8_4_ = 0x3c088908;
                auVar211._0_8_ = 0x3c0889083c088908;
                auVar211._12_4_ = 0x3c088908;
                auVar211._16_4_ = 0x3c088908;
                auVar211._20_4_ = 0x3c088908;
                auVar211._24_4_ = 0x3c088908;
                auVar211._28_4_ = 0x3c088908;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar211);
                auVar190._8_4_ = 0x3d2aa9c1;
                auVar190._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar190._12_4_ = 0x3d2aa9c1;
                auVar190._16_4_ = 0x3d2aa9c1;
                auVar190._20_4_ = 0x3d2aa9c1;
                auVar190._24_4_ = 0x3d2aa9c1;
                auVar190._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar190);
                auVar208._8_4_ = 0x3e2aaaaa;
                auVar208._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar208._12_4_ = 0x3e2aaaaa;
                auVar208._16_4_ = 0x3e2aaaaa;
                auVar208._20_4_ = 0x3e2aaaaa;
                auVar208._24_4_ = 0x3e2aaaaa;
                auVar208._28_4_ = 0x3e2aaaaa;
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar208);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar17,auVar84);
                auVar236._0_4_ = auVar91._0_4_ + fVar65;
                auVar236._4_4_ = auVar91._4_4_ + fVar64;
                auVar236._8_4_ = auVar91._8_4_ + fVar3;
                auVar236._12_4_ = auVar91._12_4_ + fVar125;
                auVar236._16_4_ = fVar13 + 0.0;
                auVar236._20_4_ = fVar14 + 0.0;
                auVar236._24_4_ = fVar15 + 0.0;
                auVar236._28_4_ = fVar16 + 0.0;
                auVar90._0_4_ = (int)auVar146._0_4_;
                auVar90._4_4_ = (int)auVar146._4_4_;
                auVar90._8_4_ = (int)auVar146._8_4_;
                auVar90._12_4_ = (int)auVar146._12_4_;
                auVar114._16_4_ = (int)auVar146._16_4_;
                auVar114._0_16_ = auVar90;
                auVar114._20_4_ = (int)auVar146._20_4_;
                auVar114._24_4_ = (int)auVar146._24_4_;
                auVar114._28_4_ = (int)auVar146._28_4_;
                auVar126 = vpslld_avx(auVar90,0x17);
                auVar91 = vpslld_avx(auVar114._16_16_,0x17);
                auVar163._8_4_ = 0x3f800000;
                auVar163._0_8_ = 0x3f8000003f800000;
                auVar163._12_4_ = 0x3f800000;
                auVar91 = vpaddd_avx(auVar91,auVar163);
                auVar126 = vpaddd_avx(auVar126,auVar163);
                auVar115._16_16_ = auVar91;
                auVar115._0_16_ = auVar126;
                auVar90 = vfmadd213ps_fma(auVar115,auVar236,auVar79);
                auVar150._8_4_ = 0x800000;
                auVar150._0_8_ = 0x80000000800000;
                auVar150._12_4_ = 0x800000;
                auVar150._16_4_ = 0x800000;
                auVar150._20_4_ = 0x800000;
                auVar150._24_4_ = 0x800000;
                auVar150._28_4_ = 0x800000;
                auVar146 = vmaxps_avx(ZEXT1632(auVar90),auVar150);
                auVar126 = vpsrld_avx(auVar146._0_16_,0x17);
                auVar91 = vpsrld_avx(auVar146._16_16_,0x17);
                auVar267._8_4_ = 0x807fffff;
                auVar267._0_8_ = 0x807fffff807fffff;
                auVar267._12_4_ = 0x807fffff;
                auVar267._16_4_ = 0x807fffff;
                auVar267._20_4_ = 0x807fffff;
                auVar267._24_4_ = 0x807fffff;
                auVar267._28_4_ = 0x807fffff;
                auVar146 = vandps_avx(auVar267,auVar146);
                auVar253 = vorps_avx(auVar146,auVar111);
                auVar268._8_4_ = 0x3f3504f3;
                auVar268._0_8_ = 0x3f3504f33f3504f3;
                auVar268._12_4_ = 0x3f3504f3;
                auVar268._16_4_ = 0x3f3504f3;
                auVar268._20_4_ = 0x3f3504f3;
                auVar268._24_4_ = 0x3f3504f3;
                auVar268._28_4_ = 0x3f3504f3;
                auVar84 = vcmpps_avx(auVar268,auVar253,2);
                auVar146 = vandnps_avx(auVar84,auVar253);
                auVar200._8_4_ = 0xbf800000;
                auVar200._0_8_ = 0xbf800000bf800000;
                auVar200._12_4_ = 0xbf800000;
                auVar200._16_4_ = 0xbf800000;
                auVar200._20_4_ = 0xbf800000;
                auVar200._24_4_ = 0xbf800000;
                auVar200._28_4_ = 0xbf800000;
                auVar151._0_4_ = auVar146._0_4_ + auVar253._0_4_ + -1.0;
                auVar151._4_4_ = auVar146._4_4_ + auVar253._4_4_ + -1.0;
                auVar151._8_4_ = auVar146._8_4_ + auVar253._8_4_ + -1.0;
                auVar151._12_4_ = auVar146._12_4_ + auVar253._12_4_ + -1.0;
                auVar151._16_4_ = auVar146._16_4_ + auVar253._16_4_ + -1.0;
                auVar151._20_4_ = auVar146._20_4_ + auVar253._20_4_ + -1.0;
                auVar151._24_4_ = auVar146._24_4_ + auVar253._24_4_ + -1.0;
                auVar151._28_4_ = auVar146._28_4_ + auVar253._28_4_ + -1.0;
                auVar91 = vpsubd_avx(auVar91,auVar84._16_16_);
                auVar271._8_4_ = 0xffffff81;
                auVar271._0_8_ = 0xffffff81ffffff81;
                auVar271._12_4_ = 0xffffff81;
                auVar91 = vpaddd_avx(auVar91,auVar271);
                auVar126 = vpsubd_avx(auVar126,auVar84._0_16_);
                auVar126 = vpaddd_avx(auVar126,auVar271);
                auVar237._16_16_ = auVar91;
                auVar237._0_16_ = auVar126;
                auVar257._0_4_ = auVar151._0_4_ * auVar151._0_4_;
                auVar257._4_4_ = auVar151._4_4_ * auVar151._4_4_;
                auVar257._8_4_ = auVar151._8_4_ * auVar151._8_4_;
                auVar257._12_4_ = auVar151._12_4_ * auVar151._12_4_;
                auVar257._16_4_ = auVar151._16_4_ * auVar151._16_4_;
                auVar257._20_4_ = auVar151._20_4_ * auVar151._20_4_;
                auVar257._24_4_ = auVar151._24_4_ * auVar151._24_4_;
                auVar257._28_4_ = 0;
                auVar269._8_4_ = 0x3d9021bb;
                auVar269._0_8_ = 0x3d9021bb3d9021bb;
                auVar269._12_4_ = 0x3d9021bb;
                auVar269._16_4_ = 0x3d9021bb;
                auVar269._20_4_ = 0x3d9021bb;
                auVar269._24_4_ = 0x3d9021bb;
                auVar269._28_4_ = 0x3d9021bb;
                auVar286._8_4_ = 0xbdebd1b8;
                auVar286._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar286._12_4_ = 0xbdebd1b8;
                auVar286._16_4_ = 0xbdebd1b8;
                auVar286._20_4_ = 0xbdebd1b8;
                auVar286._24_4_ = 0xbdebd1b8;
                auVar286._28_4_ = 0xbdebd1b8;
                auVar91 = vfmadd213ps_fma(auVar269,auVar151,auVar286);
                auVar287._8_4_ = 0x3def251a;
                auVar287._0_8_ = 0x3def251a3def251a;
                auVar287._12_4_ = 0x3def251a;
                auVar287._16_4_ = 0x3def251a;
                auVar287._20_4_ = 0x3def251a;
                auVar287._24_4_ = 0x3def251a;
                auVar287._28_4_ = 0x3def251a;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar287);
                auVar288._8_4_ = 0xbdfe5d4f;
                auVar288._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar288._12_4_ = 0xbdfe5d4f;
                auVar288._16_4_ = 0xbdfe5d4f;
                auVar288._20_4_ = 0xbdfe5d4f;
                auVar288._24_4_ = 0xbdfe5d4f;
                auVar288._28_4_ = 0xbdfe5d4f;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar288);
                auVar289._8_4_ = 0x3e11e9bf;
                auVar289._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar289._12_4_ = 0x3e11e9bf;
                auVar289._16_4_ = 0x3e11e9bf;
                auVar289._20_4_ = 0x3e11e9bf;
                auVar289._24_4_ = 0x3e11e9bf;
                auVar289._28_4_ = 0x3e11e9bf;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar289);
                auVar290._8_4_ = 0xbe2aae50;
                auVar290._0_8_ = 0xbe2aae50be2aae50;
                auVar290._12_4_ = 0xbe2aae50;
                auVar290._16_4_ = 0xbe2aae50;
                auVar290._20_4_ = 0xbe2aae50;
                auVar290._24_4_ = 0xbe2aae50;
                auVar290._28_4_ = 0xbe2aae50;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar290);
                auVar291._8_4_ = 0x3e4cceac;
                auVar291._0_8_ = 0x3e4cceac3e4cceac;
                auVar291._12_4_ = 0x3e4cceac;
                auVar291._16_4_ = 0x3e4cceac;
                auVar291._20_4_ = 0x3e4cceac;
                auVar291._24_4_ = 0x3e4cceac;
                auVar291._28_4_ = 0x3e4cceac;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar291);
                auVar292._8_4_ = 0xbe7ffffc;
                auVar292._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar292._12_4_ = 0xbe7ffffc;
                auVar292._16_4_ = 0xbe7ffffc;
                auVar292._20_4_ = 0xbe7ffffc;
                auVar292._24_4_ = 0xbe7ffffc;
                auVar292._28_4_ = 0xbe7ffffc;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar292);
                auVar293._8_4_ = 0x3eaaaaaa;
                auVar293._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar293._12_4_ = 0x3eaaaaaa;
                auVar293._16_4_ = 0x3eaaaaaa;
                auVar293._20_4_ = 0x3eaaaaaa;
                auVar293._24_4_ = 0x3eaaaaaa;
                auVar293._28_4_ = 0x3eaaaaaa;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar151,auVar293);
                auVar270._0_4_ = auVar257._0_4_ * auVar151._0_4_ * auVar91._0_4_;
                auVar270._4_4_ = auVar257._4_4_ * auVar151._4_4_ * auVar91._4_4_;
                auVar270._8_4_ = auVar257._8_4_ * auVar151._8_4_ * auVar91._8_4_;
                auVar270._12_4_ = auVar257._12_4_ * auVar151._12_4_ * auVar91._12_4_;
                auVar270._16_4_ = auVar257._16_4_ * auVar151._16_4_ * 0.0;
                auVar270._20_4_ = auVar257._20_4_ * auVar151._20_4_ * 0.0;
                auVar270._24_4_ = auVar257._24_4_ * auVar151._24_4_ * 0.0;
                auVar270._28_4_ = 0;
                auVar84 = vcvtdq2ps_avx(auVar237);
                auVar91 = vfmadd231ps_fma(auVar270,auVar84,auVar297);
                auVar91 = vfmsub231ps_fma(ZEXT1632(auVar91),auVar111,auVar257);
                auVar146 = vcmpps_avx(ZEXT1632(auVar90),_DAT_005a70a0,2);
                auVar253 = vsubps_avx(ZEXT1632(auVar91),auVar151);
                auVar91 = vfmsub231ps_fma(auVar253,auVar308,auVar84);
                auVar294._8_4_ = 0xc0000000;
                auVar294._0_8_ = 0xc0000000c0000000;
                auVar294._12_4_ = 0xc0000000;
                auVar294._16_4_ = 0xc0000000;
                auVar294._20_4_ = 0xc0000000;
                auVar294._24_4_ = 0xc0000000;
                auVar294._28_4_ = 0xc0000000;
                auVar152._0_4_ = auVar91._0_4_ * -2.0;
                auVar152._4_4_ = auVar91._4_4_ * -2.0;
                auVar152._8_4_ = auVar91._8_4_ * -2.0;
                auVar152._12_4_ = auVar91._12_4_ * -2.0;
                auVar152._16_4_ = 0x80000000;
                auVar152._20_4_ = 0x80000000;
                auVar152._24_4_ = 0x80000000;
                auVar152._28_4_ = 0;
                auVar238._8_4_ = 0x7fffffff;
                auVar238._0_8_ = 0x7fffffff7fffffff;
                auVar238._12_4_ = 0x7fffffff;
                auVar238._16_4_ = 0x7fffffff;
                auVar238._20_4_ = 0x7fffffff;
                auVar238._24_4_ = 0x7fffffff;
                auVar238._28_4_ = 0x7fffffff;
                auVar146 = vblendvps_avx(auVar152,auVar238,auVar146);
                auVar146 = vminps_avx(auVar302,auVar146);
                auVar153._8_4_ = 0xc2b0c0a5;
                auVar153._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar153._12_4_ = 0xc2b0c0a5;
                auVar153._16_4_ = 0xc2b0c0a5;
                auVar153._20_4_ = 0xc2b0c0a5;
                auVar153._24_4_ = 0xc2b0c0a5;
                auVar153._28_4_ = 0xc2b0c0a5;
                auVar84 = vmaxps_avx(auVar146,auVar153);
                auVar154._8_4_ = 0x3fb8aa3b;
                auVar154._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar154._12_4_ = 0x3fb8aa3b;
                auVar154._16_4_ = 0x3fb8aa3b;
                auVar154._20_4_ = 0x3fb8aa3b;
                auVar154._24_4_ = 0x3fb8aa3b;
                auVar154._28_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar154,auVar84,auVar111);
                auVar253 = vroundps_avx(ZEXT1632(auVar91),1);
                auVar146 = vcmpps_avx(ZEXT1632(auVar91),auVar253,1);
                auVar146 = vandps_avx(auVar79,auVar146);
                auVar146 = vsubps_avx(auVar253,auVar146);
                auVar91 = vfmsub231ps_fma(auVar84,auVar146,auVar308);
                auVar126 = vfnmsub231ps_fma(ZEXT1632(auVar91),auVar146,auVar297);
                auVar84 = ZEXT1632(auVar126);
                auVar18._28_4_ = auVar253._28_4_;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(auVar126._12_4_ * auVar126._12_4_,
                                        CONCAT48(auVar126._8_4_ * auVar126._8_4_,
                                                 CONCAT44(auVar126._4_4_ * auVar126._4_4_,
                                                          auVar126._0_4_ * auVar126._0_4_))));
                auVar258._8_4_ = 0x39506967;
                auVar258._0_8_ = 0x3950696739506967;
                auVar258._12_4_ = 0x39506967;
                auVar258._16_4_ = 0x39506967;
                auVar258._20_4_ = 0x39506967;
                auVar258._24_4_ = 0x39506967;
                auVar258._28_4_ = 0x39506967;
                auVar204 = ZEXT3264(auVar79);
                auVar250._8_4_ = 0x3ab743ce;
                auVar250._0_8_ = 0x3ab743ce3ab743ce;
                auVar250._12_4_ = 0x3ab743ce;
                auVar250._16_4_ = 0x3ab743ce;
                auVar250._20_4_ = 0x3ab743ce;
                auVar250._24_4_ = 0x3ab743ce;
                auVar250._28_4_ = 0x3ab743ce;
                auVar91 = vfmadd213ps_fma(auVar258,auVar84,auVar250);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar211);
                auVar212 = ZEXT864(0) << 0x20;
                auVar251._8_4_ = 0x3d2aa9c1;
                auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar251._12_4_ = 0x3d2aa9c1;
                auVar251._16_4_ = 0x3d2aa9c1;
                auVar251._20_4_ = 0x3d2aa9c1;
                auVar251._24_4_ = 0x3d2aa9c1;
                auVar251._28_4_ = 0x3d2aa9c1;
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar251);
                auVar84 = ZEXT1632(auVar126);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar208);
                auVar209 = ZEXT3264(auVar111);
                auVar91 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar84,auVar111);
                auVar90 = vfmadd213ps_fma(ZEXT1632(auVar91),auVar18,auVar84);
                auVar92._0_4_ = (int)auVar146._0_4_;
                auVar92._4_4_ = (int)auVar146._4_4_;
                auVar92._8_4_ = (int)auVar146._8_4_;
                auVar92._12_4_ = (int)auVar146._12_4_;
                auVar116._16_4_ = (int)auVar146._16_4_;
                auVar116._0_16_ = auVar92;
                auVar116._20_4_ = (int)auVar146._20_4_;
                auVar116._24_4_ = (int)auVar146._24_4_;
                auVar116._28_4_ = (int)auVar146._28_4_;
                auVar126 = vpslld_avx(auVar92,0x17);
                auVar91 = vpslld_avx(auVar116._16_16_,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar163);
                auVar126 = vpaddd_avx(auVar126,auVar163);
                auVar117._16_16_ = auVar91;
                auVar117._0_16_ = auVar126;
                auVar155._0_4_ = auVar90._0_4_ + fVar65;
                auVar155._4_4_ = auVar90._4_4_ + fVar64;
                auVar155._8_4_ = auVar90._8_4_ + fVar3;
                auVar155._12_4_ = auVar90._12_4_ + fVar125;
                auVar155._16_4_ = fVar13 + 0.0;
                auVar155._20_4_ = fVar14 + 0.0;
                auVar155._24_4_ = fVar15 + 0.0;
                auVar155._28_4_ = fVar16 + 0.0;
                auVar91 = vfmadd213ps_fma(auVar117,auVar155,auVar79);
                auVar79 = vdivps_avx(auVar79,ZEXT1632(auVar91));
                auVar91 = vfnmadd213ps_fma(auVar79,auVar294,auVar200);
                auVar110 = ZEXT1628(auVar91);
                goto LAB_0053740a;
              case 6:
                puVar53 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar53;
                auVar123._4_4_ = uVar2;
                auVar123._0_4_ = uVar2;
                auVar123._8_4_ = uVar2;
                auVar123._12_4_ = uVar2;
                auVar123._16_4_ = uVar2;
                auVar123._20_4_ = uVar2;
                auVar123._24_4_ = uVar2;
                auVar123._28_4_ = uVar2;
                uVar2 = puVar53[1];
                auVar159._4_4_ = uVar2;
                auVar159._0_4_ = uVar2;
                auVar159._8_4_ = uVar2;
                auVar159._12_4_ = uVar2;
                auVar159._16_4_ = uVar2;
                auVar159._20_4_ = uVar2;
                auVar159._24_4_ = uVar2;
                auVar159._28_4_ = uVar2;
                auVar91 = vfmadd231ps_fma(auVar159,auVar82,auVar123);
                auVar111 = vmaxps_avx(ZEXT1632(auVar91),auVar146);
                auVar79 = vminps_avx(auVar111,auVar79);
                auVar110 = auVar79._0_28_;
LAB_0053740a:
                auVar82._4_4_ = auVar110._4_4_ * fVar89;
                auVar82._0_4_ = auVar110._0_4_ * fVar63;
                auVar82._8_4_ = auVar110._8_4_ * auVar82._8_4_;
                auVar82._12_4_ = auVar110._12_4_ * auVar82._12_4_;
                auVar82._16_4_ = auVar110._16_4_ * auVar82._16_4_;
                auVar82._20_4_ = auVar110._20_4_ * auVar82._20_4_;
                auVar82._24_4_ = auVar110._24_4_ * auVar82._24_4_;
              }
              auVar126 = auVar82._16_16_;
              auVar91 = auVar82._0_16_;
              if (iVar45 == 1) {
                *(int *)*local_1d0 = auVar82._0_4_;
                uVar2 = vextractps_avx(auVar91,1);
                *(undefined4 *)((long)*local_1d0 + lVar55 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar91,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 3) * 4) = uVar2;
                *(int *)((long)*local_1d0 + (long)(iVar57 * 4) * 4) = auVar82._16_4_;
                uVar2 = vextractps_avx(auVar126,1);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 5) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar126,2);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 6) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar126,3);
                *(undefined4 *)((long)*local_1d0 + (long)(iVar57 * 7) * 4) = uVar2;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 4);
              }
              else if (iVar45 == 4) {
                *(undefined1 (*) [16])*local_1d0 = auVar91;
                *(undefined1 (*) [16])((long)*local_1d0 + lVar55 * 4) = auVar126;
                local_1d0 = (undefined1 (*) [32])((long)*local_1d0 + 0x10);
              }
              else if (iVar45 == 8) {
                *local_1d0 = auVar82;
                local_1d0 = local_1d0 + 1;
              }
              lVar32 = local_1a8._0_8_ + 1;
              iVar43 = iVar43 + iVar48 * local_c8.elempack;
              local_148 = local_148 + lVar30 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar30 * 4;
              local_1a8._0_8_ = lVar32;
            } while (lVar32 != lVar31);
          }
          local_200 = local_200 + 1;
        } while (local_200 != uVar40);
      }
      iVar43 = iVar28 + uVar40 * -8;
      iVar45 = iVar43 + 3;
      if (-1 < iVar43) {
        iVar45 = iVar43;
      }
      if (3 < iVar43) {
        auVar204 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar203._8_4_ = 0x3f000000;
        auVar203._0_8_ = 0x3f0000003f000000;
        auVar203._12_4_ = 0x3f000000;
        auVar205._8_4_ = 0x3f800000;
        auVar205._0_8_ = 0x3f8000003f800000;
        auVar205._12_4_ = 0x3f800000;
        local_168 = 0;
        auVar295._8_4_ = 0xc2b0c0a5;
        auVar295._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar295._12_4_ = 0xc2b0c0a5;
        auVar298._8_4_ = 0x3ab743ce;
        auVar298._0_8_ = 0x3ab743ce3ab743ce;
        auVar298._12_4_ = 0x3ab743ce;
        auVar210._8_4_ = 0x3e2aaaaa;
        auVar210._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar210._12_4_ = 0x3e2aaaaa;
        do {
          lVar55 = (long)top_blob->w;
          if (0 < lVar55) {
            uVar26 = local_c8.h * local_c8.elempack;
            iVar43 = top_blob->elempack;
            uVar33 = (long)(int)(uVar40 * 8) + local_168 * 4;
            uVar51 = (uint)uVar33;
            local_180 = (undefined1 (*) [16])
                        ((int)((long)((ulong)(uint)((int)uVar51 >> 0x1f) << 0x20 |
                                     uVar33 & 0xffffffff) / (long)iVar43) * lVar55 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar49 = uVar51 + 7;
            if (-1 < (int)uVar51) {
              uVar49 = uVar51;
            }
            auVar21._8_8_ = 0;
            auVar21._0_8_ = local_118._8_8_;
            local_118 = auVar21 << 0x40;
            iVar42 = 0;
            lVar31 = 0;
            local_148 = lVar61 * 4;
            do {
              auVar209 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar91 = ZEXT816(0) << 0x40;
              if (pvVar7 != (void *)0x0) {
                auVar91 = *(undefined1 (*) [16])((long)pvVar7 + uVar33 * 4);
              }
              auVar212 = ZEXT1664(auVar91);
              pauVar60 = (undefined1 (*) [16])
                         ((this->weight_data_tm).cstep *
                          (long)(((int)(uVar51 - (uVar49 & 0xfffffff8)) >> 2) + ((int)uVar49 >> 3))
                          * (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              if ((int)uVar26 < 8) {
                auVar88 = ZEXT864(0);
                auVar303 = ZEXT864(0);
                uVar27 = 0;
              }
              else {
                auVar303 = ZEXT864(0);
                auVar88 = ZEXT864(0);
                iVar41 = 0;
                do {
                  lVar32 = (long)(iVar41 / local_c8.elempack) * (long)local_c8.w * local_c8.elemsize
                  ;
                  if (local_c8.elempack == 8) {
                    if (0 < iVar5) {
                      puVar53 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar32 + (long)iVar42 * 4);
                      iVar44 = iVar5;
                      do {
                        uVar2 = *puVar53;
                        auVar164._4_4_ = uVar2;
                        auVar164._0_4_ = uVar2;
                        auVar164._8_4_ = uVar2;
                        auVar164._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar164,auVar212._0_16_,*pauVar60);
                        uVar2 = puVar53[1];
                        auVar240._4_4_ = uVar2;
                        auVar240._0_4_ = uVar2;
                        auVar240._8_4_ = uVar2;
                        auVar240._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar240,auVar303._0_16_,pauVar60[1]);
                        uVar2 = puVar53[2];
                        auVar259._4_4_ = uVar2;
                        auVar259._0_4_ = uVar2;
                        auVar259._8_4_ = uVar2;
                        auVar259._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar259,auVar88._0_16_,pauVar60[2]);
                        uVar2 = puVar53[3];
                        auVar272._4_4_ = uVar2;
                        auVar272._0_4_ = uVar2;
                        auVar272._8_4_ = uVar2;
                        auVar272._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar272,auVar209._0_16_,pauVar60[3]);
                        uVar2 = puVar53[4];
                        auVar213._4_4_ = uVar2;
                        auVar213._0_4_ = uVar2;
                        auVar213._8_4_ = uVar2;
                        auVar213._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar213,auVar91,pauVar60[4]);
                        auVar212 = ZEXT1664(auVar91);
                        uVar2 = puVar53[5];
                        auVar304._4_4_ = uVar2;
                        auVar304._0_4_ = uVar2;
                        auVar304._8_4_ = uVar2;
                        auVar304._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar304,auVar126,pauVar60[5]);
                        auVar303 = ZEXT1664(auVar91);
                        uVar2 = puVar53[6];
                        auVar128._4_4_ = uVar2;
                        auVar128._0_4_ = uVar2;
                        auVar128._8_4_ = uVar2;
                        auVar128._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar128,auVar90,pauVar60[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[7];
                        auVar93._4_4_ = uVar2;
                        auVar93._0_4_ = uVar2;
                        auVar93._8_4_ = uVar2;
                        auVar93._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar93,auVar92,pauVar60[7]);
                        auVar209 = ZEXT1664(auVar91);
                        pauVar60 = pauVar60 + 8;
                        puVar53 = puVar53 + iVar6 * 8;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                      goto LAB_005378d7;
                    }
                  }
                  else {
                    puVar53 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar32 + (long)(local_c8.elempack * iVar48 * (int)lVar31) * 4);
LAB_005378d7:
                    if (local_c8.elempack == 4) {
                      iVar44 = iVar5;
                      if (iVar5 < 1) goto LAB_005379ea;
                      do {
                        uVar2 = *puVar53;
                        auVar165._4_4_ = uVar2;
                        auVar165._0_4_ = uVar2;
                        auVar165._8_4_ = uVar2;
                        auVar165._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar165,auVar212._0_16_,*pauVar60);
                        uVar2 = puVar53[1];
                        auVar241._4_4_ = uVar2;
                        auVar241._0_4_ = uVar2;
                        auVar241._8_4_ = uVar2;
                        auVar241._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar241,auVar303._0_16_,pauVar60[1]);
                        uVar2 = puVar53[2];
                        auVar260._4_4_ = uVar2;
                        auVar260._0_4_ = uVar2;
                        auVar260._8_4_ = uVar2;
                        auVar260._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar260,auVar88._0_16_,pauVar60[2]);
                        uVar2 = puVar53[3];
                        auVar273._4_4_ = uVar2;
                        auVar273._0_4_ = uVar2;
                        auVar273._8_4_ = uVar2;
                        auVar273._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar273,auVar209._0_16_,pauVar60[3]);
                        uVar2 = puVar53[lVar61];
                        auVar214._4_4_ = uVar2;
                        auVar214._0_4_ = uVar2;
                        auVar214._8_4_ = uVar2;
                        auVar214._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar214,auVar91,pauVar60[4]);
                        auVar212 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 1];
                        auVar305._4_4_ = uVar2;
                        auVar305._0_4_ = uVar2;
                        auVar305._8_4_ = uVar2;
                        auVar305._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar305,auVar126,pauVar60[5]);
                        auVar303 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 2];
                        auVar129._4_4_ = uVar2;
                        auVar129._0_4_ = uVar2;
                        auVar129._8_4_ = uVar2;
                        auVar129._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar129,auVar90,pauVar60[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61 + 3];
                        auVar94._4_4_ = uVar2;
                        auVar94._0_4_ = uVar2;
                        auVar94._8_4_ = uVar2;
                        auVar94._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar94,auVar92,pauVar60[7]);
                        auVar209 = ZEXT1664(auVar91);
                        pauVar60 = pauVar60 + 8;
                        puVar53 = puVar53 + iVar6 * 4;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                    if ((local_c8.elempack == 1) && (iVar44 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar53;
                        auVar166._4_4_ = uVar2;
                        auVar166._0_4_ = uVar2;
                        auVar166._8_4_ = uVar2;
                        auVar166._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar166,auVar212._0_16_,*pauVar60);
                        uVar2 = puVar53[lVar61];
                        auVar242._4_4_ = uVar2;
                        auVar242._0_4_ = uVar2;
                        auVar242._8_4_ = uVar2;
                        auVar242._12_4_ = uVar2;
                        auVar126 = vfmadd132ps_fma(auVar242,auVar303._0_16_,pauVar60[1]);
                        uVar2 = puVar53[iVar25 * 2];
                        auVar261._4_4_ = uVar2;
                        auVar261._0_4_ = uVar2;
                        auVar261._8_4_ = uVar2;
                        auVar261._12_4_ = uVar2;
                        auVar90 = vfmadd132ps_fma(auVar261,auVar88._0_16_,pauVar60[2]);
                        uVar2 = puVar53[iVar25 * 3];
                        auVar274._4_4_ = uVar2;
                        auVar274._0_4_ = uVar2;
                        auVar274._8_4_ = uVar2;
                        auVar274._12_4_ = uVar2;
                        auVar92 = vfmadd132ps_fma(auVar274,auVar209._0_16_,pauVar60[3]);
                        uVar2 = puVar53[iVar25 * 4];
                        auVar215._4_4_ = uVar2;
                        auVar215._0_4_ = uVar2;
                        auVar215._8_4_ = uVar2;
                        auVar215._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar215,auVar91,pauVar60[4]);
                        auVar212 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 5];
                        auVar306._4_4_ = uVar2;
                        auVar306._0_4_ = uVar2;
                        auVar306._8_4_ = uVar2;
                        auVar306._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar306,auVar126,pauVar60[5]);
                        auVar303 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 6];
                        auVar130._4_4_ = uVar2;
                        auVar130._0_4_ = uVar2;
                        auVar130._8_4_ = uVar2;
                        auVar130._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar130,auVar90,pauVar60[6]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 7];
                        auVar95._4_4_ = uVar2;
                        auVar95._0_4_ = uVar2;
                        auVar95._8_4_ = uVar2;
                        auVar95._12_4_ = uVar2;
                        auVar91 = vfmadd132ps_fma(auVar95,auVar92,pauVar60[7]);
                        auVar209 = ZEXT1664(auVar91);
                        pauVar60 = pauVar60 + 8;
                        puVar53 = puVar53 + lVar29;
                        iVar44 = iVar44 + -1;
                      } while (iVar44 != 0);
                    }
                  }
LAB_005379ea:
                  iVar44 = iVar41 + 0xf;
                  uVar27 = uVar26 & 0xfffffff8;
                  iVar41 = iVar41 + 8;
                } while (iVar44 < (int)uVar26);
              }
              auVar126 = auVar88._0_16_;
              auVar91 = auVar209._0_16_;
              if ((int)(uVar27 | 3) < (int)uVar26) {
                uVar52 = uVar27;
                do {
                  lVar32 = (long)((int)uVar52 / local_c8.elempack) *
                           (long)local_c8.w * local_c8.elemsize;
                  if (local_c8.elempack == 4) {
                    if (0 < iVar5) {
                      puVar53 = (undefined4 *)
                                ((long)(_func_int ***)local_c8.data + lVar32 + (long)iVar42 * 4);
                      iVar41 = iVar5;
                      do {
                        uVar2 = *puVar53;
                        auVar167._4_4_ = uVar2;
                        auVar167._0_4_ = uVar2;
                        auVar167._8_4_ = uVar2;
                        auVar167._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar212._0_16_,auVar167,*pauVar60);
                        auVar212 = ZEXT1664(auVar91);
                        uVar2 = puVar53[1];
                        auVar168._4_4_ = uVar2;
                        auVar168._0_4_ = uVar2;
                        auVar168._8_4_ = uVar2;
                        auVar168._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar303._0_16_,auVar168,pauVar60[1]);
                        auVar303 = ZEXT1664(auVar91);
                        uVar2 = puVar53[2];
                        auVar169._4_4_ = uVar2;
                        auVar169._0_4_ = uVar2;
                        auVar169._8_4_ = uVar2;
                        auVar169._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_16_,auVar169,pauVar60[2]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[3];
                        auVar170._4_4_ = uVar2;
                        auVar170._0_4_ = uVar2;
                        auVar170._8_4_ = uVar2;
                        auVar170._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar209._0_16_,auVar170,pauVar60[3]);
                        auVar209 = ZEXT1664(auVar91);
                        pauVar60 = pauVar60 + 4;
                        puVar53 = puVar53 + iVar6 * 4;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                      goto LAB_00537ab7;
                    }
                  }
                  else {
                    puVar53 = (undefined4 *)
                              ((long)(_func_int ***)local_c8.data +
                              lVar32 + (long)(local_c8.elempack * iVar48 * (int)lVar31) * 4);
LAB_00537ab7:
                    if ((local_c8.elempack == 1) && (iVar41 = iVar5, 0 < iVar5)) {
                      do {
                        uVar2 = *puVar53;
                        auVar171._4_4_ = uVar2;
                        auVar171._0_4_ = uVar2;
                        auVar171._8_4_ = uVar2;
                        auVar171._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar212._0_16_,auVar171,*pauVar60);
                        auVar212 = ZEXT1664(auVar91);
                        uVar2 = puVar53[lVar61];
                        auVar172._4_4_ = uVar2;
                        auVar172._0_4_ = uVar2;
                        auVar172._8_4_ = uVar2;
                        auVar172._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar303._0_16_,auVar172,pauVar60[1]);
                        auVar303 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 2];
                        auVar173._4_4_ = uVar2;
                        auVar173._0_4_ = uVar2;
                        auVar173._8_4_ = uVar2;
                        auVar173._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar88._0_16_,auVar173,pauVar60[2]);
                        auVar88 = ZEXT1664(auVar91);
                        uVar2 = puVar53[iVar25 * 3];
                        auVar174._4_4_ = uVar2;
                        auVar174._0_4_ = uVar2;
                        auVar174._8_4_ = uVar2;
                        auVar174._12_4_ = uVar2;
                        auVar91 = vfmadd231ps_fma(auVar209._0_16_,auVar174,pauVar60[3]);
                        auVar209 = ZEXT1664(auVar91);
                        pauVar60 = pauVar60 + 4;
                        puVar53 = puVar53 + lVar29;
                        iVar41 = iVar41 + -1;
                      } while (iVar41 != 0);
                    }
                  }
                  auVar126 = auVar88._0_16_;
                  auVar91 = auVar209._0_16_;
                  uVar27 = uVar52 + 4;
                  iVar41 = uVar52 + 7;
                  uVar52 = uVar27;
                } while (iVar41 < (int)uVar26);
              }
              auVar90 = auVar303._0_16_;
              uVar34 = (ulong)uVar27;
              if ((int)(uVar27 | 1) < (int)uVar26) {
                lVar37 = (long)local_c8.w * local_c8.elemsize * uVar34;
                lVar50 = (long)(_func_int ***)local_c8.data + lVar37 + local_148;
                lVar32 = (long)local_c8.w * local_c8.elemsize * 2;
                lVar37 = (long)(_func_int ***)local_c8.data + lVar37 + local_118._0_8_;
                do {
                  if (0 < iVar5) {
                    lVar38 = 0;
                    iVar41 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)(lVar37 + lVar38);
                      auVar175._4_4_ = uVar2;
                      auVar175._0_4_ = uVar2;
                      auVar175._8_4_ = uVar2;
                      auVar175._12_4_ = uVar2;
                      auVar90 = vfmadd231ps_fma(auVar212._0_16_,auVar175,*pauVar60);
                      auVar212 = ZEXT1664(auVar90);
                      uVar2 = *(undefined4 *)(lVar50 + lVar38);
                      auVar176._4_4_ = uVar2;
                      auVar176._0_4_ = uVar2;
                      auVar176._8_4_ = uVar2;
                      auVar176._12_4_ = uVar2;
                      auVar90 = vfmadd231ps_fma(auVar303._0_16_,auVar176,pauVar60[1]);
                      auVar303 = ZEXT1664(auVar90);
                      pauVar60 = pauVar60 + 2;
                      lVar38 = lVar38 + lVar29 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar90 = auVar303._0_16_;
                  uVar34 = uVar34 + 2;
                  uVar27 = (uint)uVar34;
                  lVar50 = lVar50 + lVar32;
                  lVar37 = lVar37 + lVar32;
                } while ((int)(uVar27 | 1) < (int)uVar26);
              }
              auVar92 = auVar212._0_16_;
              if ((int)uVar27 < (int)uVar26) {
                uVar34 = (ulong)uVar27;
                puVar53 = (undefined4 *)
                          ((long)(_func_int ***)local_c8.data +
                          (long)local_c8.w * local_c8.elemsize * uVar34 + local_118._0_8_);
                do {
                  puVar58 = puVar53;
                  iVar41 = iVar5;
                  if (0 < iVar5) {
                    do {
                      uVar2 = *puVar58;
                      auVar177._4_4_ = uVar2;
                      auVar177._0_4_ = uVar2;
                      auVar177._8_4_ = uVar2;
                      auVar177._12_4_ = uVar2;
                      auVar92 = vfmadd231ps_fma(auVar212._0_16_,auVar177,*pauVar60);
                      auVar212 = ZEXT1664(auVar92);
                      pauVar60 = pauVar60 + 1;
                      puVar58 = puVar58 + lVar29;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  auVar92 = auVar212._0_16_;
                  uVar34 = uVar34 + 1;
                  puVar53 = (undefined4 *)((long)puVar53 + (long)local_c8.w * local_c8.elemsize);
                } while ((int)uVar34 < (int)uVar26);
              }
              auVar96._0_4_ = auVar126._0_4_ + auVar91._0_4_ + auVar90._0_4_ + auVar92._0_4_;
              auVar96._4_4_ = auVar126._4_4_ + auVar91._4_4_ + auVar90._4_4_ + auVar92._4_4_;
              auVar96._8_4_ = auVar126._8_4_ + auVar91._8_4_ + auVar90._8_4_ + auVar92._8_4_;
              auVar96._12_4_ = auVar126._12_4_ + auVar91._12_4_ + auVar90._12_4_ + auVar92._12_4_;
              auVar91 = auVar204._0_16_;
              switch(uVar36) {
              case 1:
                auVar96 = vmaxps_avx(auVar91,auVar96);
                break;
              case 2:
                auVar126 = vmaxps_avx(auVar91,auVar96);
                auVar91 = vminps_avx(auVar91,auVar96);
                uVar2 = *(this->super_Convolution1D).activation_params.data;
                auVar99._4_4_ = uVar2;
                auVar99._0_4_ = uVar2;
                auVar99._8_4_ = uVar2;
                auVar99._12_4_ = uVar2;
                auVar96 = vfmadd213ps_fma(auVar99,auVar91,auVar126);
                break;
              case 3:
                puVar53 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar53;
                auVar133._4_4_ = uVar2;
                auVar133._0_4_ = uVar2;
                auVar133._8_4_ = uVar2;
                auVar133._12_4_ = uVar2;
                uVar2 = puVar53[1];
                auVar184._4_4_ = uVar2;
                auVar184._0_4_ = uVar2;
                auVar184._8_4_ = uVar2;
                auVar184._12_4_ = uVar2;
                auVar91 = vmaxps_avx(auVar96,auVar133);
                auVar96 = vminps_avx(auVar91,auVar184);
                break;
              case 4:
                uVar34 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
                auVar97._0_8_ = uVar34 ^ 0x8000000080000000;
                auVar97._8_4_ = -auVar96._8_4_;
                auVar97._12_4_ = -auVar96._12_4_;
                auVar134._8_4_ = 0x42b0c0a5;
                auVar134._0_8_ = 0x42b0c0a542b0c0a5;
                auVar134._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar97,auVar134);
                auVar135._8_4_ = 0xc2b0c0a5;
                auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar135._12_4_ = 0xc2b0c0a5;
                auVar90 = vmaxps_avx(auVar91,auVar135);
                auVar136._8_4_ = 0x3fb8aa3b;
                auVar136._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar136._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar136,auVar90,auVar203);
                auVar185._0_4_ = (int)auVar91._0_4_;
                auVar185._4_4_ = (int)auVar91._4_4_;
                auVar185._8_4_ = (int)auVar91._8_4_;
                auVar185._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar185);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar70._8_4_ = 0x3f318000;
                auVar70._0_8_ = 0x3f3180003f318000;
                auVar70._12_4_ = 0x3f318000;
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar70);
                auVar186._8_4_ = 0x395e8083;
                auVar186._0_8_ = 0x395e8083395e8083;
                auVar186._12_4_ = 0x395e8083;
                auVar90 = vfmsub231ps_fma(auVar126,auVar91,auVar186);
                auVar187._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar187._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar187._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar187._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar222._8_4_ = 0x39506967;
                auVar222._0_8_ = 0x3950696739506967;
                auVar222._12_4_ = 0x39506967;
                auVar249._8_4_ = 0x3ab743ce;
                auVar249._0_8_ = 0x3ab743ce3ab743ce;
                auVar249._12_4_ = 0x3ab743ce;
                auVar126 = vfmadd213ps_fma(auVar222,auVar90,auVar249);
                auVar197._8_4_ = 0x3c088908;
                auVar197._0_8_ = 0x3c0889083c088908;
                auVar197._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar197);
                auVar71._8_4_ = 0x3d2aa9c1;
                auVar71._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar71._12_4_ = 0x3d2aa9c1;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar71);
                auVar72._8_4_ = 0x3e2aaaaa;
                auVar72._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar72._12_4_ = 0x3e2aaaaa;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar72);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar187,auVar90);
                auVar98._0_4_ = auVar126._0_4_ + 1.0;
                auVar98._4_4_ = auVar126._4_4_ + 1.0;
                auVar98._8_4_ = auVar126._8_4_ + 1.0;
                auVar98._12_4_ = auVar126._12_4_ + 1.0;
                auVar137._0_4_ = (int)auVar91._0_4_;
                auVar137._4_4_ = (int)auVar91._4_4_;
                auVar137._8_4_ = (int)auVar91._8_4_;
                auVar137._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar137,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar91 = vfmadd213ps_fma(auVar91,auVar98,auVar205);
                auVar96 = vdivps_avx(auVar205,auVar91);
                break;
              case 5:
                auVar307._8_4_ = 0x42b0c0a5;
                auVar307._0_8_ = 0x42b0c0a542b0c0a5;
                auVar307._12_4_ = 0x42b0c0a5;
                auVar91 = vminps_avx(auVar307,auVar96);
                auVar90 = vmaxps_avx(auVar295,auVar91);
                auVar178._8_4_ = 0x3fb8aa3b;
                auVar178._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar178._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar178,auVar90,auVar203);
                auVar216._0_4_ = (int)auVar91._0_4_;
                auVar216._4_4_ = (int)auVar91._4_4_;
                auVar216._8_4_ = (int)auVar91._8_4_;
                auVar216._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar216);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar67._8_4_ = 0x3f318000;
                auVar67._0_8_ = 0x3f3180003f318000;
                auVar67._12_4_ = 0x3f318000;
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar67);
                auVar252._8_4_ = 0xb95e8083;
                auVar252._0_8_ = 0xb95e8083b95e8083;
                auVar252._12_4_ = 0xb95e8083;
                auVar90 = vfnmsub231ps_fma(auVar126,auVar91,auVar252);
                auVar217._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar217._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar217._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar217._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar243._8_4_ = 0x39506967;
                auVar243._0_8_ = 0x3950696739506967;
                auVar243._12_4_ = 0x39506967;
                auVar126 = vfmadd213ps_fma(auVar243,auVar90,auVar298);
                auVar195._8_4_ = 0x3c088908;
                auVar195._0_8_ = 0x3c0889083c088908;
                auVar195._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar195);
                auVar196._8_4_ = 0x3d2aa9c1;
                auVar196._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar196._12_4_ = 0x3d2aa9c1;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar196);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar210);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar217,auVar90);
                auVar218._0_4_ = auVar126._0_4_ + 1.0;
                auVar218._4_4_ = auVar126._4_4_ + 1.0;
                auVar218._8_4_ = auVar126._8_4_ + 1.0;
                auVar218._12_4_ = auVar126._12_4_ + 1.0;
                auVar131._0_4_ = (int)auVar91._0_4_;
                auVar131._4_4_ = (int)auVar91._4_4_;
                auVar131._8_4_ = (int)auVar91._8_4_;
                auVar131._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar131,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar163 = vfmadd213ps_fma(auVar91,auVar218,auVar205);
                auVar179._8_4_ = 0x800000;
                auVar179._0_8_ = 0x80000000800000;
                auVar179._12_4_ = 0x800000;
                auVar91 = vmaxps_avx(auVar163,auVar179);
                auVar126 = vpsrld_avx(auVar91,0x17);
                auVar244._8_4_ = 0xffffff82;
                auVar244._0_8_ = 0xffffff82ffffff82;
                auVar244._12_4_ = 0xffffff82;
                auVar126 = vpaddd_avx(auVar126,auVar244);
                auVar245._8_4_ = 0x807fffff;
                auVar245._0_8_ = 0x807fffff807fffff;
                auVar245._12_4_ = 0x807fffff;
                auVar91 = vandps_avx(auVar245,auVar91);
                auVar92 = vorps_avx(auVar91,auVar203);
                auVar90 = vcvtdq2ps_avx(auVar126);
                auVar246._8_4_ = 0x3f3504f3;
                auVar246._0_8_ = 0x3f3504f33f3504f3;
                auVar246._12_4_ = 0x3f3504f3;
                auVar126 = vcmpps_avx(auVar92,auVar246,1);
                auVar91 = vandps_avx(auVar126,auVar92);
                auVar180._0_4_ = auVar91._0_4_ + auVar92._0_4_ + -1.0;
                auVar180._4_4_ = auVar91._4_4_ + auVar92._4_4_ + -1.0;
                auVar180._8_4_ = auVar91._8_4_ + auVar92._8_4_ + -1.0;
                auVar180._12_4_ = auVar91._12_4_ + auVar92._12_4_ + -1.0;
                auVar91 = vandps_avx(auVar126,auVar205);
                auVar126 = vsubps_avx(auVar90,auVar91);
                auVar247._0_4_ = auVar180._0_4_ * auVar180._0_4_;
                auVar247._4_4_ = auVar180._4_4_ * auVar180._4_4_;
                auVar247._8_4_ = auVar180._8_4_ * auVar180._8_4_;
                auVar247._12_4_ = auVar180._12_4_ * auVar180._12_4_;
                auVar262._8_4_ = 0x3d9021bb;
                auVar262._0_8_ = 0x3d9021bb3d9021bb;
                auVar262._12_4_ = 0x3d9021bb;
                auVar275._8_4_ = 0xbdebd1b8;
                auVar275._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar275._12_4_ = 0xbdebd1b8;
                auVar91 = vfmadd213ps_fma(auVar262,auVar180,auVar275);
                auVar276._8_4_ = 0x3def251a;
                auVar276._0_8_ = 0x3def251a3def251a;
                auVar276._12_4_ = 0x3def251a;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar276);
                auVar277._8_4_ = 0xbdfe5d4f;
                auVar277._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar277._12_4_ = 0xbdfe5d4f;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar277);
                auVar278._8_4_ = 0x3e11e9bf;
                auVar278._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar278._12_4_ = 0x3e11e9bf;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar278);
                auVar279._8_4_ = 0xbe2aae50;
                auVar279._0_8_ = 0xbe2aae50be2aae50;
                auVar279._12_4_ = 0xbe2aae50;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar279);
                auVar280._8_4_ = 0x3e4cceac;
                auVar280._0_8_ = 0x3e4cceac3e4cceac;
                auVar280._12_4_ = 0x3e4cceac;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar280);
                auVar281._8_4_ = 0xbe7ffffc;
                auVar281._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar281._12_4_ = 0xbe7ffffc;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar281);
                auVar282._8_4_ = 0x3eaaaaaa;
                auVar282._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar282._12_4_ = 0x3eaaaaaa;
                auVar91 = vfmadd213ps_fma(auVar91,auVar180,auVar282);
                auVar263._0_4_ = auVar247._0_4_ * auVar180._0_4_ * auVar91._0_4_;
                auVar263._4_4_ = auVar247._4_4_ * auVar180._4_4_ * auVar91._4_4_;
                auVar263._8_4_ = auVar247._8_4_ * auVar180._8_4_ * auVar91._8_4_;
                auVar263._12_4_ = auVar247._12_4_ * auVar180._12_4_ * auVar91._12_4_;
                auVar91 = vfmadd231ps_fma(auVar263,auVar126,auVar252);
                auVar90 = vfmsub231ps_fma(auVar91,auVar203,auVar247);
                auVar91 = vcmpps_avx(auVar163,_DAT_005a34f0,2);
                auVar90 = vsubps_avx(auVar90,auVar180);
                auVar126 = vfnmadd231ps_fma(auVar90,auVar67,auVar126);
                auVar181._0_4_ = auVar126._0_4_ + auVar126._0_4_;
                auVar181._4_4_ = auVar126._4_4_ + auVar126._4_4_;
                auVar181._8_4_ = auVar126._8_4_ + auVar126._8_4_;
                auVar181._12_4_ = auVar126._12_4_ + auVar126._12_4_;
                auVar219._8_4_ = 0x7fffffff;
                auVar219._0_8_ = 0x7fffffff7fffffff;
                auVar219._12_4_ = 0x7fffffff;
                auVar91 = vblendvps_avx(auVar181,auVar219,auVar91);
                auVar91 = vminps_avx(auVar307,auVar91);
                auVar90 = vmaxps_avx(auVar295,auVar91);
                auVar182._8_4_ = 0x3fb8aa3b;
                auVar182._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar182._12_4_ = 0x3fb8aa3b;
                auVar91 = vfmadd213ps_fma(auVar182,auVar90,auVar203);
                auVar220._0_4_ = (int)auVar91._0_4_;
                auVar220._4_4_ = (int)auVar91._4_4_;
                auVar220._8_4_ = (int)auVar91._8_4_;
                auVar220._12_4_ = (int)auVar91._12_4_;
                auVar126 = vcvtdq2ps_avx(auVar220);
                auVar91 = vcmpps_avx(auVar91,auVar126,1);
                auVar91 = vandps_avx(auVar91,auVar205);
                auVar91 = vsubps_avx(auVar126,auVar91);
                auVar126 = vfmsub231ps_fma(auVar90,auVar91,auVar67);
                auVar90 = vfnmsub231ps_fma(auVar126,auVar91,auVar252);
                auVar221._0_4_ = auVar90._0_4_ * auVar90._0_4_;
                auVar221._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar221._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar221._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar248._8_4_ = 0x39506967;
                auVar248._0_8_ = 0x3950696739506967;
                auVar248._12_4_ = 0x39506967;
                auVar204 = ZEXT864(0);
                auVar126 = vfmadd213ps_fma(auVar248,auVar90,auVar298);
                auVar68._8_4_ = 0x3c088908;
                auVar68._0_8_ = 0x3c0889083c088908;
                auVar68._12_4_ = 0x3c088908;
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar68);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar196);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar210);
                auVar126 = vfmadd213ps_fma(auVar126,auVar90,auVar203);
                auVar126 = vfmadd213ps_fma(auVar126,auVar221,auVar90);
                auVar132._0_4_ = auVar126._0_4_ + 1.0;
                auVar132._4_4_ = auVar126._4_4_ + 1.0;
                auVar132._8_4_ = auVar126._8_4_ + 1.0;
                auVar132._12_4_ = auVar126._12_4_ + 1.0;
                auVar183._0_4_ = (int)auVar91._0_4_;
                auVar183._4_4_ = (int)auVar91._4_4_;
                auVar183._8_4_ = (int)auVar91._8_4_;
                auVar183._12_4_ = (int)auVar91._12_4_;
                auVar91 = vpslld_avx(auVar183,0x17);
                auVar91 = vpaddd_avx(auVar91,auVar205);
                auVar91 = vfmadd213ps_fma(auVar91,auVar132,auVar205);
                auVar69._8_4_ = 0x40000000;
                auVar69._0_8_ = 0x4000000040000000;
                auVar69._12_4_ = 0x40000000;
                auVar91 = vdivps_avx(auVar69,auVar91);
                auVar96 = vfmsub231ps_fma(auVar96,auVar96,auVar91);
                break;
              case 6:
                puVar53 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar2 = *puVar53;
                auVar138._4_4_ = uVar2;
                auVar138._0_4_ = uVar2;
                auVar138._8_4_ = uVar2;
                auVar138._12_4_ = uVar2;
                uVar2 = puVar53[1];
                auVar188._4_4_ = uVar2;
                auVar188._0_4_ = uVar2;
                auVar188._8_4_ = uVar2;
                auVar188._12_4_ = uVar2;
                auVar126 = vfmadd231ps_fma(auVar188,auVar96,auVar138);
                auVar91 = vmaxps_avx(auVar91,auVar126);
                auVar91 = vminps_avx(auVar91,auVar205);
                auVar96._0_4_ = auVar91._0_4_ * auVar96._0_4_;
                auVar96._4_4_ = auVar91._4_4_ * auVar96._4_4_;
                auVar96._8_4_ = auVar91._8_4_ * auVar96._8_4_;
                auVar96._12_4_ = auVar91._12_4_ * auVar96._12_4_;
              }
              if (iVar43 == 1) {
                *(int *)*local_180 = auVar96._0_4_;
                uVar2 = vextractps_avx(auVar96,1);
                *(undefined4 *)((long)*local_180 + (long)iVar57 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar96,2);
                *(undefined4 *)((long)*local_180 + (long)(iVar57 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar96,3);
                *(undefined4 *)((long)*local_180 + (long)(iVar57 * 3) * 4) = uVar2;
                local_180 = (undefined1 (*) [16])((long)*local_180 + 4);
              }
              else if (iVar43 == 4) {
                *local_180 = auVar96;
                local_180 = local_180 + 1;
              }
              lVar31 = lVar31 + 1;
              iVar42 = iVar42 + iVar48 * local_c8.elempack;
              local_148 = local_148 + lVar30 * 4;
              local_118._0_8_ = local_118._0_8_ + lVar30 * 4;
            } while (lVar31 != lVar55);
          }
          local_168 = local_168 + 1;
        } while (local_168 != (uint)(iVar45 >> 2));
      }
      uVar36 = uVar40 * 8 + (iVar45 >> 2) * 4;
      local_60 = (ulong)uVar36;
      uVar33 = (ulong)(uint)((int)(iVar28 - uVar36) / 2);
      local_68 = uVar33;
      if (1 < (int)(iVar28 - uVar36)) {
        uVar49 = local_c8.h * local_c8.elempack;
        uVar40 = top_blob->w;
        local_70 = (long)(int)uVar40 * top_blob->elemsize;
        sVar8 = (this->weight_data_tm).elemsize;
        sVar9 = (this->weight_data_tm).cstep;
        iVar28 = local_c8.elempack * iVar48;
        bVar62 = local_c8.elempack == 1;
        local_f8 = uVar49 & 0xfffffff8;
        iVar57 = local_c8.elempack * iVar48;
        lVar31 = (long)(iVar6 * 4) * 4;
        local_38 = top_blob->data;
        local_40 = (this->weight_data_tm).data;
        local_48 = (long)(int)uVar36;
        lVar55 = lVar29 * 4;
        local_50 = lVar61 * 4;
        local_178 = 0;
        do {
          pvVar10 = local_c8.data;
          if (0 < (int)uVar40) {
            lVar32 = local_48 + local_178 * 2;
            puVar53 = (undefined4 *)((local_48 + local_178 * 2 + 1) * local_70 + (long)local_38);
            puVar58 = (undefined4 *)(lVar32 * local_70 + (long)local_38);
            uVar36 = (uint)lVar32;
            uVar51 = uVar36 + 3;
            uVar26 = uVar36 + 7;
            if (-1 < (int)uVar36) {
              uVar51 = uVar36;
              uVar26 = uVar36;
            }
            cVar23 = (char)lVar32 - ((byte)uVar26 & 0xf8);
            pauVar59 = (undefined1 (*) [32])
                       ((long)(((int)(uVar36 - (uVar51 & 0xfffffffc)) >> 1) + ((int)uVar26 >> 3) +
                              (int)((char)(((byte)(cVar23 >> 7) >> 6) + cVar23) >> 2)) *
                        sVar8 * sVar9 + (long)local_40);
            lVar37 = (long)local_c8.w * local_c8.elemsize;
            pfVar56 = (float *)(this->super_Convolution1D).activation_params.data;
            local_150 = (long)(_func_int ***)local_c8.data + local_50;
            iVar45 = 0;
            local_1e0 = (Allocator *)local_c8.data;
            local_200 = 0;
            do {
              if (pvVar7 == (void *)0x0) {
                fVar65 = 0.0;
                fVar64 = 0.0;
              }
              else {
                pfVar1 = (float *)((long)pvVar7 + lVar32 * 4);
                fVar65 = *pfVar1;
                fVar64 = pfVar1[1];
              }
              pauVar54 = pauVar59;
              if ((int)uVar49 < 8) {
                auVar79 = SUB6432(ZEXT864(0),0);
                auVar308 = SUB6432(ZEXT864(0),0);
                uVar36 = 0;
              }
              else {
                auVar204 = ZEXT864(0);
                auVar209 = ZEXT864(0);
                iVar43 = 0;
                do {
                  lVar50 = (iVar43 / iVar4) * lVar37;
                  if (iVar4 == 8) {
                    if (0 < iVar5) {
                      pauVar35 = (undefined1 (*) [32])
                                 ((long)(_func_int ***)pvVar10 + lVar50 + (long)iVar45 * 4);
                      iVar42 = iVar5;
                      do {
                        auVar91 = vfmadd231ps_fma(auVar209._0_32_,*pauVar35,*pauVar54);
                        auVar209 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,*pauVar35,pauVar54[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 2;
                        pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar6 * 8) * 4);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                      goto LAB_0053847f;
                    }
                  }
                  else {
                    pauVar35 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar10 +
                               lVar50 + (long)(iVar28 * (int)local_200) * 4);
LAB_0053847f:
                    if (iVar4 == 4) {
                      iVar42 = iVar5;
                      if (iVar5 < 1) goto LAB_00538542;
                      do {
                        auVar193._16_16_ = *(undefined1 (*) [16])(*pauVar35 + lVar61 * 4);
                        auVar193._0_16_ = *(undefined1 (*) [16])*pauVar35;
                        auVar91 = vfmadd231ps_fma(auVar209._0_32_,auVar193,*pauVar54);
                        auVar209 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar193,pauVar54[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 2;
                        pauVar35 = (undefined1 (*) [32])(*pauVar35 + lVar31);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                    iVar42 = iVar5;
                    if (0 < iVar5 && bVar62) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar35),
                                                ZEXT416(*(uint *)(*pauVar35 + lVar61 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar35 +
                                                                         (long)(iVar25 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar35 +
                                                                         (long)(iVar25 * 3) * 4)),
                                                0x30);
                        auVar126 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar35 +
                                                                  (long)(iVar25 * 4) * 4)),
                                                 ZEXT416(*(uint *)(*pauVar35 +
                                                                  (long)(iVar25 * 5) * 4)),0x10);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar35 +
                                                                           (long)(iVar25 * 6) * 4)),
                                                 0x20);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar35 +
                                                                           (long)(iVar25 * 7) * 4)),
                                                 0x30);
                        auVar194._16_16_ = auVar126;
                        auVar194._0_16_ = auVar91;
                        auVar91 = vfmadd231ps_fma(auVar209._0_32_,auVar194,*pauVar54);
                        auVar209 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar194,pauVar54[1]);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 2;
                        pauVar35 = (undefined1 (*) [32])(*pauVar35 + lVar55);
                        iVar42 = iVar42 + -1;
                      } while (iVar42 != 0);
                    }
                  }
LAB_00538542:
                  auVar308 = auVar204._0_32_;
                  auVar79 = auVar209._0_32_;
                  iVar42 = iVar43 + 0xf;
                  iVar43 = iVar43 + 8;
                  uVar36 = local_f8;
                } while (iVar42 < (int)uVar49);
              }
              auVar91 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar91);
              if ((int)(uVar36 | 3) < (int)uVar49) {
                auVar209 = ZEXT864(0);
                uVar26 = uVar36;
                do {
                  lVar50 = ((int)uVar26 / iVar4) * lVar37;
                  if (iVar4 == 4) {
                    if (0 < iVar5) {
                      pauVar60 = (undefined1 (*) [16])
                                 ((long)(_func_int ***)pvVar10 + lVar50 + (long)iVar45 * 4);
                      iVar43 = iVar5;
                      do {
                        auVar91 = vfmadd231ps_fma(auVar204._0_16_,*pauVar60,
                                                  *(undefined1 (*) [16])*pauVar54);
                        auVar204 = ZEXT1664(auVar91);
                        auVar91 = vfmadd231ps_fma(auVar209._0_16_,*pauVar60,
                                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
                        auVar209 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 1;
                        pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar31);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_005385f3;
                    }
                  }
                  else {
                    pauVar60 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar10 +
                               lVar50 + (long)(iVar28 * (int)local_200) * 4);
LAB_005385f3:
                    iVar43 = iVar5;
                    if (0 < iVar5 && bVar62) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar60),
                                                ZEXT416(*(uint *)(*pauVar60 + lVar61 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar60 +
                                                                         (long)(iVar25 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar60 +
                                                                         (long)(iVar25 * 3) * 4)),
                                                0x30);
                        auVar126 = vfmadd231ps_fma(auVar204._0_16_,auVar91,
                                                   *(undefined1 (*) [16])*pauVar54);
                        auVar204 = ZEXT1664(auVar126);
                        auVar91 = vfmadd231ps_fma(auVar209._0_16_,auVar91,
                                                  *(undefined1 (*) [16])(*pauVar54 + 0x10));
                        auVar209 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 1;
                        pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar55);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  auVar126 = auVar209._0_16_;
                  auVar91 = auVar204._0_16_;
                  uVar36 = uVar26 + 4;
                  iVar43 = uVar26 + 7;
                  uVar26 = uVar36;
                } while (iVar43 < (int)uVar49);
              }
              else {
                auVar126 = SUB6416(ZEXT864(0),0);
              }
              uVar34 = (ulong)uVar36;
              auVar139._0_4_ = auVar79._16_4_ + auVar79._0_4_;
              auVar139._4_4_ = auVar79._20_4_ + auVar79._4_4_;
              auVar139._8_4_ = auVar79._24_4_ + auVar79._8_4_;
              auVar139._12_4_ = auVar79._28_4_ + auVar79._12_4_;
              auVar90 = vshufpd_avx(auVar139,auVar139,1);
              auVar140._0_4_ = auVar90._0_4_ + auVar139._0_4_;
              auVar140._4_4_ = auVar90._4_4_ + auVar139._4_4_;
              auVar140._8_4_ = auVar90._8_4_ + auVar139._8_4_;
              auVar140._12_4_ = auVar90._12_4_ + auVar139._12_4_;
              auVar100._0_4_ = auVar308._16_4_ + auVar308._0_4_;
              auVar100._4_4_ = auVar308._20_4_ + auVar308._4_4_;
              auVar100._8_4_ = auVar308._24_4_ + auVar308._8_4_;
              auVar100._12_4_ = auVar308._28_4_ + auVar308._12_4_;
              auVar90 = vshufpd_avx(auVar100,auVar100,1);
              auVar101._0_4_ = auVar90._0_4_ + auVar100._0_4_;
              auVar101._4_4_ = auVar90._4_4_ + auVar100._4_4_;
              auVar101._8_4_ = auVar90._8_4_ + auVar100._8_4_;
              auVar101._12_4_ = auVar90._12_4_ + auVar100._12_4_;
              auVar90 = vshufpd_avx(auVar91,auVar91,1);
              auVar198._0_4_ = auVar90._0_4_ + auVar91._0_4_;
              auVar198._4_4_ = auVar90._4_4_ + auVar91._4_4_;
              auVar198._8_4_ = auVar90._8_4_ + auVar91._8_4_;
              auVar198._12_4_ = auVar90._12_4_ + auVar91._12_4_;
              auVar91 = vinsertps_avx(auVar101,auVar140,0x4c);
              auVar90 = vshufpd_avx(auVar126,auVar126,1);
              auVar189._0_4_ = auVar90._0_4_ + auVar126._0_4_;
              auVar189._4_4_ = auVar90._4_4_ + auVar126._4_4_;
              auVar189._8_4_ = auVar90._8_4_ + auVar126._8_4_;
              auVar189._12_4_ = auVar90._12_4_ + auVar126._12_4_;
              auVar126 = vinsertps_avx(auVar140,auVar101,0x1c);
              auVar90 = vinsertps_avx(auVar189,auVar198,0x4c);
              auVar92 = vinsertps_avx(auVar198,auVar189,0x1c);
              auVar204 = ZEXT1664(CONCAT412(auVar91._12_4_ + 0.0 + auVar126._12_4_ + auVar90._12_4_
                                            + auVar92._12_4_,
                                            CONCAT48(auVar91._8_4_ + 0.0 +
                                                     auVar126._8_4_ + auVar90._8_4_ + auVar92._8_4_,
                                                     CONCAT44(auVar91._4_4_ + fVar64 +
                                                              auVar126._4_4_ + auVar90._4_4_ +
                                                              auVar92._4_4_,
                                                              auVar91._0_4_ + fVar65 +
                                                              auVar126._0_4_ + auVar90._0_4_ +
                                                              auVar92._0_4_))));
              if ((int)(uVar36 | 1) < (int)uVar49) {
                lVar50 = local_150 + lVar37 * uVar34;
                ppp_Var39 = (_func_int ***)((long)&local_1e0->_vptr_Allocator + lVar37 * uVar34);
                do {
                  if (0 < iVar5) {
                    lVar38 = 0;
                    iVar43 = iVar5;
                    do {
                      uVar2 = *(undefined4 *)((long)ppp_Var39 + lVar38);
                      auVar73._4_4_ = uVar2;
                      auVar73._0_4_ = uVar2;
                      auVar73._8_4_ = uVar2;
                      auVar73._12_4_ = uVar2;
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = *(ulong *)*pauVar54;
                      auVar91 = vfmadd213ps_fma(auVar102,auVar73,auVar204._0_16_);
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = *(ulong *)(*pauVar54 + 8);
                      uVar2 = *(undefined4 *)(lVar50 + lVar38);
                      auVar206._4_4_ = uVar2;
                      auVar206._0_4_ = uVar2;
                      auVar206._8_4_ = uVar2;
                      auVar206._12_4_ = uVar2;
                      auVar91 = vfmadd213ps_fma(auVar206,auVar74,auVar91);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                      lVar38 = lVar38 + lVar55;
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  uVar34 = uVar34 + 2;
                  uVar36 = (uint)uVar34;
                  lVar50 = lVar50 + lVar37 * 2;
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar37 * 2);
                } while ((int)(uVar36 | 1) < (int)uVar49);
              }
              auVar91 = auVar204._0_16_;
              if ((int)uVar36 < (int)uVar49) {
                uVar34 = (ulong)uVar36;
                ppp_Var39 = (_func_int ***)((long)&local_1e0->_vptr_Allocator + lVar37 * uVar34);
                do {
                  ppp_Var47 = ppp_Var39;
                  iVar43 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = *(ulong *)*pauVar54;
                      uVar2 = *(undefined4 *)ppp_Var47;
                      auVar103._4_4_ = uVar2;
                      auVar103._0_4_ = uVar2;
                      auVar103._8_4_ = uVar2;
                      auVar103._12_4_ = uVar2;
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,auVar75,auVar103);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 8);
                      ppp_Var47 = (_func_int ***)((long)ppp_Var47 + lVar55);
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  auVar91 = auVar204._0_16_;
                  uVar34 = uVar34 + 1;
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar37);
                } while ((int)uVar34 < (int)uVar49);
              }
              fVar65 = auVar91._0_4_;
              auVar207 = auVar91;
              switch((int)local_78) {
              case 1:
                auVar207 = vmaxps_avx(auVar91,_DAT_005a34f0);
                break;
              case 2:
                auVar126 = vcmpps_avx(ZEXT816(0) << 0x40,auVar91,1);
                fVar64 = *pfVar56;
                auVar106._4_4_ = fVar64;
                auVar106._0_4_ = fVar64;
                auVar106._8_4_ = fVar64;
                auVar106._12_4_ = fVar64;
                auVar142._8_4_ = 0x3f800000;
                auVar142._0_8_ = 0x3f8000003f800000;
                auVar142._12_4_ = 0x3f800000;
                auVar126 = vblendvps_avx(auVar106,auVar142,auVar126);
                goto LAB_0053890c;
              case 3:
                auVar76._8_8_ = 0;
                auVar76._0_8_ = *(ulong *)pfVar56;
                auVar126 = vmaxss_avx(auVar76,auVar91);
                auVar90 = vinsertps_avx(auVar76,auVar126,0x10);
                auVar126 = vinsertps_avx(auVar76,auVar91,0x4c);
                auVar126 = vcmpps_avx(auVar126,auVar90,1);
                auVar91 = vinsertps_avx(auVar90,auVar91,0x4c);
                auVar91 = vblendvps_avx(auVar91,auVar76,auVar126);
                auVar207 = vshufps_avx(auVar91,auVar91,0xe1);
                auVar91 = vcmpps_avx(auVar76,auVar207,1);
                if ((auVar91 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  auVar207 = vinsertps_avx(auVar207,auVar76,0x50);
                }
                break;
              case 4:
                auVar141._8_4_ = 0x42b0c0a5;
                auVar141._0_8_ = 0x42b0c0a542b0c0a5;
                auVar141._12_4_ = 0x42b0c0a5;
                auVar126 = vminps_avx(auVar91,auVar141);
                auVar104._8_4_ = 0xc2b0c0a5;
                auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar104._12_4_ = 0xc2b0c0a5;
                auVar91 = vcmpps_avx(auVar126,auVar104,1);
                auVar77._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
                auVar77._8_4_ = auVar126._8_4_ ^ 0x80000000;
                auVar77._12_4_ = auVar126._12_4_ ^ 0x80000000;
                auVar91 = vblendvps_avx(auVar77,auVar141,auVar91);
                local_1a8._0_4_ = expf(auVar91._0_4_);
                local_1a8._4_4_ = extraout_XMM0_Db_00;
                local_1a8._8_4_ = extraout_XMM0_Dc_00;
                local_1a8._12_4_ = extraout_XMM0_Dd_00;
                auVar91 = vmovshdup_avx(auVar91);
                auVar209._0_4_ = expf(auVar91._0_4_);
                auVar209._4_60_ = extraout_var_00;
                auVar91 = vinsertps_avx(local_1a8,auVar209._0_16_,0x10);
                auVar105._8_4_ = 0x3f800000;
                auVar105._0_8_ = 0x3f8000003f800000;
                auVar105._12_4_ = 0x3f800000;
                auVar78._0_4_ = auVar91._0_4_ + 1.0;
                auVar78._4_4_ = auVar91._4_4_ + 1.0;
                auVar78._8_4_ = auVar91._8_4_ + 1.0;
                auVar78._12_4_ = auVar91._12_4_ + 1.0;
                auVar207 = vdivps_avx(auVar105,auVar78);
                break;
              case 5:
                fVar64 = expf(fVar65);
                fVar64 = logf(fVar64 + 1.0);
                local_118._0_4_ = tanhf(fVar64);
                local_118._4_4_ = extraout_XMM0_Db;
                local_118._8_4_ = extraout_XMM0_Dc;
                local_118._12_4_ = extraout_XMM0_Dd;
                auVar126 = vmovshdup_avx(auVar91);
                fVar64 = expf(auVar126._0_4_);
                fVar64 = logf(fVar64 + 1.0);
                auVar204._0_4_ = tanhf(fVar64);
                auVar204._4_60_ = extraout_var;
                auVar126 = vinsertps_avx(local_118,auVar204._0_16_,0x10);
LAB_0053890c:
                auVar207._0_4_ = auVar126._0_4_ * fVar65;
                auVar207._4_4_ = auVar126._4_4_ * auVar91._4_4_;
                auVar207._8_4_ = auVar126._8_4_ * auVar91._8_4_;
                auVar207._12_4_ = auVar126._12_4_ * auVar91._12_4_;
                break;
              case 6:
                fVar64 = *pfVar56;
                fVar3 = pfVar56[1];
                fVar125 = -fVar3 / fVar64;
                auVar126 = SUB6416(ZEXT464(0),0) << 0x20;
                if ((fVar125 <= fVar65) && (auVar126 = auVar91, fVar65 <= fVar125 + 1.0 / fVar64)) {
                  auVar126 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar64),ZEXT416((uint)fVar3));
                  auVar126 = ZEXT416((uint)(auVar126._0_4_ * fVar65));
                }
                auVar90 = vmovshdup_avx(auVar91);
                fVar65 = auVar90._0_4_;
                if (fVar125 <= fVar65) {
                  auVar207._4_12_ = auVar91._4_12_;
                  auVar207._0_4_ = (float)auVar126._0_4_;
                  if (fVar65 <= fVar125 + 1.0 / fVar64) {
                    auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar64),auVar90,ZEXT416((uint)fVar3));
                    auVar207 = vinsertps_avx(auVar207,ZEXT416((uint)(auVar91._0_4_ * fVar65)),0x10);
                  }
                }
                else {
                  auVar207 = vblendps_avx(auVar126,_DAT_005a34f0,0xe);
                }
              }
              *puVar58 = auVar207._0_4_;
              uVar2 = vextractps_avx(auVar207,1);
              *puVar53 = uVar2;
              puVar58 = puVar58 + 1;
              puVar53 = puVar53 + 1;
              local_200 = local_200 + 1;
              iVar45 = iVar45 + iVar57;
              local_150 = local_150 + lVar30 * 4;
              local_1e0 = (Allocator *)((long)&local_1e0->_vptr_Allocator + lVar30 * 4);
            } while (local_200 != uVar40);
          }
          local_178 = local_178 + 1;
        } while (local_178 != uVar33);
      }
      iVar28 = (int)local_60 + (int)local_68 * 2;
      if (iVar28 < (int)local_80) {
        pvVar10 = top_blob->data;
        iVar57 = top_blob->w;
        sVar8 = top_blob->elemsize;
        sVar9 = (this->weight_data_tm).elemsize;
        sVar11 = (this->weight_data_tm).cstep;
        bVar62 = 0 < iVar5;
        local_190 = uVar24 & 0xfffffff8;
        local_1c8 = (ulong)iVar28;
        lVar55 = (long)(iVar6 * 4) * 4;
        lVar29 = lVar29 * 4;
        pvVar12 = (this->weight_data_tm).data;
        do {
          pvVar22 = local_c8.data;
          if (0 < (int)local_58) {
            pfVar56 = (float *)((long)iVar57 * sVar8 * local_1c8 + (long)pvVar10);
            iVar28 = (int)local_1c8;
            iVar45 = iVar28 + 7;
            if (-1 < iVar28) {
              iVar45 = iVar28;
            }
            iVar43 = iVar28 + 3;
            if (-1 < iVar28) {
              iVar43 = iVar28;
            }
            cVar23 = (char)local_1c8 - ((byte)iVar45 & 0xf8);
            pauVar59 = (undefined1 (*) [32])
                       ((long)(int)((iVar28 - (((uint)(local_1c8 >> 0x1f) & 1) + iVar28 & 0xfffffffe
                                              )) + (iVar45 >> 3) +
                                    (int)((char)((char)local_1c8 - ((byte)iVar43 & 0xfc)) / '\x02')
                                   + (int)((char)(((byte)(cVar23 >> 7) >> 6) + cVar23) >> 2)) *
                        sVar9 * sVar11 + (long)pvVar12);
            lVar31 = (long)local_c8.w * local_c8.elemsize;
            pfVar1 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1e8 = (void *)((long)(_func_int ***)local_c8.data + lVar61 * 4);
            iVar28 = 0;
            local_1e0 = (Allocator *)local_c8.data;
            local_200 = 0;
            do {
              if (pvVar7 == (void *)0x0) {
                fVar65 = 0.0;
              }
              else {
                fVar65 = *(float *)((long)pvVar7 + local_1c8 * 4);
              }
              pauVar54 = pauVar59;
              if ((int)uVar24 < 8) {
                auVar308 = SUB6432(ZEXT864(0),0);
                uVar36 = 0;
              }
              else {
                auVar204 = ZEXT864(0);
                iVar45 = 0;
                do {
                  lVar32 = (iVar45 / iVar4) * lVar31;
                  if (iVar4 == 8 && bVar62) {
                    pauVar35 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar22 + lVar32 + (long)iVar28 * 4);
                    iVar43 = iVar5;
                    do {
                      auVar91 = vfmadd231ps_fma(auVar204._0_32_,*pauVar35,*pauVar54);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar54 = pauVar54 + 1;
                      pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar6 * 8) * 4);
                      iVar43 = iVar43 + -1;
                    } while (iVar43 != 0);
                  }
                  else {
                    pauVar35 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar22 +
                               lVar32 + (long)(iVar4 * iVar48 * (int)local_200) * 4);
                  }
                  if (iVar4 == 4) {
                    iVar43 = iVar5;
                    if (0 < iVar5) {
                      do {
                        auVar160._16_16_ = *(undefined1 (*) [16])(*pauVar35 + lVar61 * 4);
                        auVar160._0_16_ = *(undefined1 (*) [16])*pauVar35;
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar160,*pauVar54);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 1;
                        pauVar35 = (undefined1 (*) [32])(*pauVar35 + lVar55);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                      goto LAB_00538da9;
                    }
                  }
                  else {
LAB_00538da9:
                    iVar43 = iVar5;
                    if (iVar4 == 1 && bVar62) {
                      do {
                        auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar35),
                                                ZEXT416(*(uint *)(*pauVar35 + lVar61 * 4)),0x10);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar35 +
                                                                         (long)(iVar25 * 2) * 4)),
                                                0x20);
                        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar35 +
                                                                         (long)(iVar25 * 3) * 4)),
                                                0x30);
                        auVar126 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar35 +
                                                                  (long)(iVar25 * 4) * 4)),
                                                 ZEXT416(*(uint *)(*pauVar35 +
                                                                  (long)(iVar25 * 5) * 4)),0x10);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar35 +
                                                                           (long)(iVar25 * 6) * 4)),
                                                 0x20);
                        auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(*pauVar35 +
                                                                           (long)(iVar25 * 7) * 4)),
                                                 0x30);
                        auVar161._16_16_ = auVar126;
                        auVar161._0_16_ = auVar91;
                        auVar91 = vfmadd231ps_fma(auVar204._0_32_,auVar161,*pauVar54);
                        auVar204 = ZEXT1664(auVar91);
                        pauVar54 = pauVar54 + 1;
                        pauVar35 = (undefined1 (*) [32])(*pauVar35 + lVar29);
                        iVar43 = iVar43 + -1;
                      } while (iVar43 != 0);
                    }
                  }
                  auVar308 = auVar204._0_32_;
                  iVar43 = iVar45 + 0xf;
                  iVar45 = iVar45 + 8;
                  uVar36 = local_190;
                } while (iVar43 < (int)uVar24);
              }
              auVar91 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar91);
              if ((int)(uVar36 | 3) < (int)uVar24) {
                uVar40 = uVar36;
                do {
                  lVar32 = ((int)uVar40 / iVar4) * lVar31;
                  if (iVar4 == 4 && bVar62) {
                    pauVar60 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar22 + lVar32 + (long)iVar28 * 4);
                    iVar45 = iVar5;
                    do {
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,*pauVar60,
                                                *(undefined1 (*) [16])*pauVar54);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                      pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar55);
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  else {
                    pauVar60 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar22 +
                               lVar32 + (long)(iVar4 * iVar48 * (int)local_200) * 4);
                  }
                  iVar45 = iVar5;
                  if (iVar4 == 1 && bVar62) {
                    do {
                      auVar91 = vinsertps_avx(ZEXT416(*(uint *)*pauVar60),
                                              ZEXT416(*(uint *)(*pauVar60 + lVar61 * 4)),0x10);
                      auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar60 +
                                                                       (long)(iVar25 * 2) * 4)),0x20
                                             );
                      auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(*pauVar60 +
                                                                       (long)(iVar25 * 3) * 4)),0x30
                                             );
                      auVar91 = vfmadd231ps_fma(auVar204._0_16_,auVar91,
                                                *(undefined1 (*) [16])*pauVar54);
                      auVar204 = ZEXT1664(auVar91);
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                      pauVar60 = (undefined1 (*) [16])(*pauVar60 + lVar29);
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  auVar91 = auVar204._0_16_;
                  uVar36 = uVar40 + 4;
                  iVar45 = uVar40 + 7;
                  uVar40 = uVar36;
                } while (iVar45 < (int)uVar24);
              }
              uVar33 = (ulong)uVar36;
              auVar107._0_4_ = auVar308._16_4_ + auVar308._0_4_;
              auVar107._4_4_ = auVar308._20_4_ + auVar308._4_4_;
              auVar107._8_4_ = auVar308._24_4_ + auVar308._8_4_;
              auVar107._12_4_ = auVar308._28_4_ + auVar308._12_4_;
              auVar126 = vshufpd_avx(auVar107,auVar107,1);
              auVar108._0_4_ = auVar126._0_4_ + auVar107._0_4_;
              auVar108._4_4_ = auVar126._4_4_ + auVar107._4_4_;
              auVar108._8_4_ = auVar126._8_4_ + auVar107._8_4_;
              auVar108._12_4_ = auVar126._12_4_ + auVar107._12_4_;
              auVar126 = vmovshdup_avx(auVar108);
              auVar90 = vshufpd_avx(auVar91,auVar91,1);
              auVar143._0_4_ = auVar90._0_4_ + auVar91._0_4_;
              auVar143._4_4_ = auVar90._4_4_ + auVar91._4_4_;
              auVar143._8_4_ = auVar90._8_4_ + auVar91._8_4_;
              auVar143._12_4_ = auVar90._12_4_ + auVar91._12_4_;
              auVar91 = vmovshdup_avx(auVar143);
              fVar65 = auVar126._0_4_ + fVar65 + auVar108._0_4_ + auVar143._0_4_ + auVar91._0_4_;
              auVar204 = ZEXT464((uint)fVar65);
              if ((int)(uVar36 | 1) < (int)uVar24) {
                pvVar46 = (void *)((long)local_1e8 + lVar31 * uVar33);
                ppp_Var39 = (_func_int ***)((long)&local_1e0->_vptr_Allocator + lVar31 * uVar33);
                do {
                  if (iVar5 < 1) {
                    auVar91 = auVar204._0_16_;
                  }
                  else {
                    lVar32 = 0;
                    iVar45 = iVar5;
                    do {
                      auVar91 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar54),auVar204._0_16_,
                                                ZEXT416(*(uint *)((long)ppp_Var39 + lVar32)));
                      auVar91 = vfmadd231ss_fma(auVar91,ZEXT416(*(uint *)(*pauVar54 + 4)),
                                                ZEXT416(*(uint *)((long)pvVar46 + lVar32)));
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 8);
                      lVar32 = lVar32 + lVar29;
                      auVar204 = ZEXT1664(auVar91);
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  auVar209 = ZEXT1664(auVar91);
                  uVar33 = uVar33 + 2;
                  uVar36 = (uint)uVar33;
                  pvVar46 = (void *)((long)pvVar46 + lVar31 * 2);
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar31 * 2);
                  auVar204 = ZEXT1664(auVar91);
                } while ((int)(uVar36 | 1) < (int)uVar24);
              }
              else {
                auVar209 = ZEXT464((uint)fVar65);
              }
              auVar91 = auVar209._0_16_;
              if ((int)uVar36 < (int)uVar24) {
                uVar33 = (ulong)uVar36;
                ppp_Var39 = (_func_int ***)((long)&local_1e0->_vptr_Allocator + lVar31 * uVar33);
                do {
                  ppp_Var47 = ppp_Var39;
                  iVar45 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar91 = vfmadd231ss_fma(auVar209._0_16_,ZEXT416(*(uint *)*pauVar54),
                                                ZEXT416(*(uint *)ppp_Var47));
                      auVar209 = ZEXT1664(auVar91);
                      pauVar54 = (undefined1 (*) [32])(*pauVar54 + 4);
                      ppp_Var47 = (_func_int ***)((long)ppp_Var47 + lVar29);
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  auVar91 = auVar209._0_16_;
                  uVar33 = uVar33 + 1;
                  ppp_Var39 = (_func_int ***)((long)ppp_Var39 + lVar31);
                } while ((int)uVar33 < (int)uVar24);
              }
              fVar64 = auVar91._0_4_;
              fVar65 = fVar64;
              switch((int)local_78) {
              case 1:
                auVar91 = vmaxss_avx(auVar91,ZEXT416(0));
                fVar65 = auVar91._0_4_;
                break;
              case 2:
                auVar91 = vcmpss_avx(ZEXT816(0) << 0x40,auVar91,1);
                auVar145._8_4_ = 0x3f800000;
                auVar145._0_8_ = 0x3f8000003f800000;
                auVar145._12_4_ = 0x3f800000;
                auVar91 = vblendvps_avx(ZEXT416((uint)*pfVar1),auVar145,auVar91);
                fVar65 = auVar91._0_4_ * fVar64;
                break;
              case 3:
                auVar91 = vmaxss_avx(auVar91,ZEXT416((uint)*pfVar1));
                fVar65 = auVar91._0_4_;
                if (pfVar1[1] < auVar91._0_4_) {
                  fVar65 = pfVar1[1];
                }
                break;
              case 4:
                auVar91 = vminss_avx(auVar91,ZEXT416(0x42b0c0a5));
                auVar109._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar109._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar109._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar91 = vcmpss_avx(auVar91,ZEXT416(0xc2b0c0a5),1);
                auVar144._8_4_ = 0x42b0c0a5;
                auVar144._0_8_ = 0x42b0c0a542b0c0a5;
                auVar144._12_4_ = 0x42b0c0a5;
                auVar91 = vblendvps_avx(auVar109,auVar144,auVar91);
                fVar65 = expf(auVar91._0_4_);
                fVar65 = 1.0 / (fVar65 + 1.0);
                break;
              case 5:
                fVar65 = expf(fVar64);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
                fVar65 = fVar65 * fVar64;
                break;
              case 6:
                fVar3 = *pfVar1;
                fVar125 = -pfVar1[1] / fVar3;
                fVar65 = 0.0;
                if ((fVar125 <= fVar64) && (fVar65 = fVar64, fVar64 <= fVar125 + 1.0 / fVar3)) {
                  auVar91 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar91,ZEXT416((uint)pfVar1[1]));
                  fVar65 = auVar91._0_4_ * fVar64;
                }
              }
              *pfVar56 = fVar65;
              pfVar56 = pfVar56 + 1;
              local_200 = local_200 + 1;
              iVar28 = iVar28 + iVar48 * iVar4;
              local_1e8 = (void *)((long)local_1e8 + lVar30 * 4);
              local_1e0 = (Allocator *)((long)&local_1e0->_vptr_Allocator + lVar30 * 4);
            } while (local_200 != local_58);
          }
          local_1c8 = local_1c8 + 1;
        } while (local_1c8 != local_80);
      }
      iVar48 = 0;
    }
  }
  piVar20 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar48;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}